

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_mb_intersector.h
# Opt level: O2

bool embree::avx512::CurveNiMBIntersectorK<4,8>::
     occluded_hn<embree::avx512::OrientedCurve1IntersectorK<embree::HermiteCurveT,8>,embree::avx512::Occluded1KEpilog1<8,true>>
               (Precalculations *pre,RayK<8> *ray,size_t k,RayQueryContext *context,Primitive *prim)

{
  ulong uVar1;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar2;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar3;
  uint uVar4;
  uint uVar5;
  Geometry *pGVar6;
  __int_type_conflict _Var7;
  long lVar8;
  RTCFilterFunctionN p_Var9;
  long lVar10;
  __int_type_conflict _Var11;
  long lVar12;
  long lVar13;
  bool bVar14;
  bool bVar15;
  bool bVar16;
  bool bVar17;
  undefined8 uVar18;
  undefined8 uVar19;
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  byte bVar24;
  uint uVar25;
  ulong uVar26;
  uint uVar28;
  long lVar29;
  ulong uVar30;
  long lVar31;
  ulong uVar32;
  bool bVar33;
  bool bVar34;
  bool bVar35;
  bool bVar36;
  bool bVar37;
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  undefined1 auVar73 [32];
  undefined1 auVar74 [32];
  undefined1 auVar75 [32];
  undefined1 auVar76 [32];
  undefined1 auVar77 [32];
  undefined1 auVar78 [32];
  undefined1 auVar79 [32];
  undefined1 auVar80 [32];
  undefined1 auVar81 [32];
  undefined1 auVar82 [32];
  undefined1 auVar83 [32];
  undefined1 auVar84 [32];
  undefined1 auVar85 [32];
  undefined1 auVar65 [16];
  undefined1 auVar86 [32];
  undefined1 auVar87 [32];
  undefined1 auVar88 [32];
  undefined1 auVar89 [32];
  undefined1 auVar91 [32];
  undefined1 auVar93 [32];
  undefined1 auVar95 [32];
  undefined1 auVar97 [32];
  int iVar99;
  undefined4 uVar100;
  vint4 bi_2;
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  vint4 bi_1;
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  vint4 bi;
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [32];
  vfloat4 b0;
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  vint4 ai;
  undefined1 auVar133 [16];
  float fVar141;
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [32];
  undefined1 auVar139 [32];
  float fVar142;
  vint4 ai_1;
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [32];
  undefined1 auVar157 [32];
  undefined1 auVar158 [32];
  undefined1 auVar159 [32];
  vfloat4 b0_1;
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [32];
  float fVar178;
  float fVar179;
  vint4 ai_2;
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  float fVar180;
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  undefined1 auVar195 [16];
  undefined1 auVar196 [16];
  undefined1 auVar197 [16];
  undefined1 auVar198 [16];
  undefined1 auVar199 [16];
  undefined1 auVar200 [16];
  float fVar207;
  vfloat4 a0_2;
  undefined1 auVar201 [16];
  undefined1 auVar202 [16];
  undefined1 auVar203 [16];
  undefined1 auVar204 [16];
  undefined1 auVar205 [32];
  undefined1 auVar206 [32];
  float fVar208;
  float fVar209;
  float fVar219;
  float fVar221;
  undefined1 auVar210 [16];
  float fVar220;
  float fVar222;
  undefined1 auVar211 [16];
  undefined1 auVar212 [16];
  undefined1 auVar213 [16];
  undefined1 auVar214 [16];
  undefined1 auVar215 [16];
  undefined1 auVar216 [16];
  undefined1 auVar217 [16];
  undefined1 auVar218 [16];
  float fVar223;
  float fVar224;
  float fVar225;
  float fVar226;
  float fVar236;
  vfloat4 b0_2;
  undefined1 auVar227 [16];
  undefined1 auVar228 [16];
  undefined1 auVar229 [16];
  undefined1 auVar230 [16];
  undefined1 auVar231 [16];
  undefined1 auVar232 [16];
  undefined1 auVar233 [16];
  undefined1 auVar234 [16];
  undefined1 auVar235 [16];
  vfloat4 a0_3;
  undefined1 auVar237 [16];
  undefined1 auVar238 [16];
  undefined1 auVar239 [16];
  undefined1 auVar240 [16];
  undefined1 auVar241 [16];
  undefined1 auVar242 [16];
  undefined1 auVar243 [16];
  undefined1 auVar244 [16];
  undefined1 auVar245 [16];
  undefined1 auVar246 [16];
  undefined1 auVar247 [16];
  undefined1 auVar249 [16];
  undefined1 auVar250 [16];
  undefined1 auVar251 [16];
  undefined1 auVar252 [16];
  undefined1 auVar253 [16];
  undefined1 auVar254 [16];
  undefined1 auVar255 [16];
  undefined1 auVar256 [16];
  undefined1 auVar257 [16];
  undefined1 auVar258 [64];
  undefined1 auVar259 [64];
  undefined1 auVar260 [64];
  undefined1 auVar261 [64];
  undefined1 auVar262 [64];
  undefined1 auVar263 [64];
  undefined1 auVar264 [64];
  undefined1 in_ZMM28 [64];
  undefined1 auVar265 [64];
  undefined1 auVar266 [64];
  vfloat_impl<4> p00;
  vfloat_impl<4> p02;
  vfloat_impl<4> p01;
  uint mask_stack [4];
  RTCFilterFunctionNArguments args;
  vfloat_impl<4> p03;
  BBox1f cu_stack [4];
  BBox1f cv_stack [4];
  uint auStack_460 [4];
  RTCFilterFunctionNArguments local_450;
  undefined1 local_420 [32];
  undefined1 local_400 [8];
  float fStack_3f8;
  float fStack_3f4;
  undefined1 local_3f0 [16];
  undefined1 local_3e0 [16];
  undefined1 local_3d0 [16];
  undefined1 local_3c0 [16];
  undefined1 local_3b0 [8];
  float fStack_3a8;
  float fStack_3a4;
  undefined1 local_3a0 [8];
  float fStack_398;
  float fStack_394;
  undefined1 local_390 [8];
  float fStack_388;
  float fStack_384;
  undefined1 local_380 [8];
  float fStack_378;
  float fStack_374;
  undefined1 local_370 [16];
  undefined1 local_360 [16];
  undefined1 local_350 [16];
  undefined1 local_340 [16];
  undefined1 local_330 [16];
  undefined1 local_320 [16];
  undefined1 local_310 [16];
  undefined1 local_300 [16];
  undefined1 local_2f0 [16];
  undefined1 local_2e0 [16];
  undefined1 local_2d0 [16];
  undefined1 local_2c0 [16];
  undefined1 local_2b0 [16];
  undefined1 local_2a0 [8];
  float fStack_298;
  float fStack_294;
  undefined1 local_290 [16];
  undefined1 local_280 [16];
  undefined1 local_270 [16];
  undefined1 local_260 [32];
  undefined1 local_240 [32];
  undefined8 uStack_220;
  undefined1 local_200 [32];
  undefined1 local_1e0 [32];
  undefined1 local_1c0 [32];
  ulong auStack_1a0 [4];
  RTCHitN local_180 [32];
  undefined1 local_160 [32];
  undefined4 local_140;
  undefined4 uStack_13c;
  undefined4 uStack_138;
  undefined4 uStack_134;
  undefined4 uStack_130;
  undefined4 uStack_12c;
  undefined4 uStack_128;
  undefined4 uStack_124;
  float local_120;
  float fStack_11c;
  float fStack_118;
  float fStack_114;
  float fStack_110;
  float fStack_10c;
  float fStack_108;
  float fStack_104;
  undefined1 local_100 [32];
  undefined8 local_e0;
  undefined8 uStack_d8;
  undefined8 uStack_d0;
  undefined8 uStack_c8;
  undefined1 local_c0 [32];
  uint local_a0;
  uint uStack_9c;
  uint uStack_98;
  uint uStack_94;
  uint uStack_90;
  uint uStack_8c;
  uint uStack_88;
  uint uStack_84;
  uint local_80;
  uint uStack_7c;
  uint uStack_78;
  uint uStack_74;
  uint uStack_70;
  uint uStack_6c;
  uint uStack_68;
  uint uStack_64;
  ulong uVar27;
  undefined1 auVar90 [32];
  undefined1 auVar92 [32];
  undefined1 auVar94 [32];
  undefined1 auVar96 [32];
  undefined1 auVar98 [32];
  float fVar132;
  float fVar140;
  undefined1 auVar248 [32];
  
  uVar26 = (ulong)(byte)prim[1];
  auVar45 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar26 * 4 + 6)));
  auVar46 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar26 * 5 + 6)));
  auVar47 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar26 * 6 + 6)));
  auVar48 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar26 * 0xf + 6)));
  lVar29 = uVar26 * 0x25;
  auVar49 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (ulong)(byte)prim[1] * 0x10 + 6)));
  auVar50 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar26 * 0x11 + 6)));
  auVar51 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar26 * 0x1a + 6)));
  auVar52 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar26 * 0x1b + 6)));
  auVar55 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar26 * 0x1c + 6)));
  uVar100 = *(undefined4 *)(prim + lVar29 + 0x12);
  auVar249._4_4_ = uVar100;
  auVar249._0_4_ = uVar100;
  auVar249._8_4_ = uVar100;
  auVar249._12_4_ = uVar100;
  auVar53 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x20)),
                          0x10);
  auVar53 = vinsertps_avx(auVar53,ZEXT416(*(uint *)(ray + k * 4 + 0x40)),0x20);
  auVar38 = vsubps_avx512vl(auVar53,*(undefined1 (*) [16])(prim + lVar29 + 6));
  fVar142 = (*(float *)(ray + k * 4 + 0xe0) - *(float *)(prim + lVar29 + 0x16)) *
            *(float *)(prim + lVar29 + 0x1a);
  auVar53._8_8_ = 0;
  auVar53._0_8_ = *(ulong *)(prim + uVar26 * 7 + 6);
  auVar58 = vpmovsxwd_avx(auVar53);
  auVar56._8_8_ = 0;
  auVar56._0_8_ = *(ulong *)(prim + uVar26 * 0xb + 6);
  auVar59 = vpmovsxwd_avx(auVar56);
  auVar62._8_8_ = 0;
  auVar62._0_8_ = *(ulong *)(prim + uVar26 * 9 + 6);
  auVar60 = vpmovsxwd_avx(auVar62);
  auVar54._8_8_ = 0;
  auVar54._0_8_ = *(ulong *)(prim + uVar26 * 0xd + 6);
  auVar61 = vpmovsxwd_avx(auVar54);
  auVar39 = vpbroadcastd_avx512vl();
  auVar63._8_8_ = 0;
  auVar63._0_8_ = *(ulong *)(prim + uVar26 * 0x12 + 6);
  auVar40 = vpmovsxwd_avx512vl(auVar63);
  auVar44._8_8_ = 0;
  auVar44._0_8_ = *(ulong *)(prim + uVar26 * 0x16 + 6);
  auVar41 = vpmovsxwd_avx512vl(auVar44);
  auVar43._8_8_ = 0;
  auVar43._0_8_ = *(ulong *)(prim + uVar26 * 0x14 + 6);
  auVar42 = vpmovsxwd_avx512vl(auVar43);
  auVar258 = ZEXT1664(auVar42);
  auVar53 = vinsertps_avx512f(ZEXT416(*(uint *)(ray + k * 4 + 0x80)),
                              ZEXT416(*(uint *)(ray + k * 4 + 0xa0)),0x10);
  auVar53 = vinsertps_avx512f(auVar53,ZEXT416(*(uint *)(ray + k * 4 + 0xc0)),0x20);
  auVar43 = vmulps_avx512vl(auVar249,auVar38);
  auVar44 = vmulps_avx512vl(auVar249,auVar53);
  auVar45 = vcvtdq2ps_avx512vl(auVar45);
  auVar46 = vcvtdq2ps_avx512vl(auVar46);
  auVar47 = vcvtdq2ps_avx512vl(auVar47);
  auVar48 = vcvtdq2ps_avx512vl(auVar48);
  auVar49 = vcvtdq2ps_avx512vl(auVar49);
  auVar53 = vcvtdq2ps_avx(auVar50);
  auVar56 = vcvtdq2ps_avx(auVar51);
  auVar62 = vcvtdq2ps_avx(auVar52);
  auVar54 = vcvtdq2ps_avx(auVar55);
  uVar100 = auVar44._0_4_;
  auVar201._4_4_ = uVar100;
  auVar201._0_4_ = uVar100;
  auVar201._8_4_ = uVar100;
  auVar201._12_4_ = uVar100;
  auVar63 = vshufps_avx(auVar44,auVar44,0x55);
  auVar44 = vshufps_avx(auVar44,auVar44,0xaa);
  auVar50 = vmulps_avx512vl(auVar44,auVar47);
  auVar66._0_4_ = auVar44._0_4_ * auVar53._0_4_;
  auVar66._4_4_ = auVar44._4_4_ * auVar53._4_4_;
  auVar66._8_4_ = auVar44._8_4_ * auVar53._8_4_;
  auVar66._12_4_ = auVar44._12_4_ * auVar53._12_4_;
  auVar65._0_4_ = auVar54._0_4_ * auVar44._0_4_;
  auVar65._4_4_ = auVar54._4_4_ * auVar44._4_4_;
  auVar65._8_4_ = auVar54._8_4_ * auVar44._8_4_;
  auVar65._12_4_ = auVar54._12_4_ * auVar44._12_4_;
  auVar44 = vfmadd231ps_avx512vl(auVar50,auVar63,auVar46);
  auVar50 = vfmadd231ps_avx512vl(auVar66,auVar63,auVar49);
  auVar63 = vfmadd231ps_fma(auVar65,auVar62,auVar63);
  auVar44 = vfmadd231ps_avx512vl(auVar44,auVar201,auVar45);
  auVar50 = vfmadd231ps_avx512vl(auVar50,auVar201,auVar48);
  auVar63 = vfmadd231ps_fma(auVar63,auVar56,auVar201);
  auVar51 = vbroadcastss_avx512vl(auVar43);
  auVar52 = vshufps_avx512vl(auVar43,auVar43,0x55);
  auVar43 = vshufps_avx512vl(auVar43,auVar43,0xaa);
  auVar47 = vmulps_avx512vl(auVar43,auVar47);
  auVar53 = vmulps_avx512vl(auVar43,auVar53);
  auVar54 = vmulps_avx512vl(auVar43,auVar54);
  auVar43 = vfmadd231ps_avx512vl(auVar47,auVar52,auVar46);
  auVar46 = vfmadd231ps_avx512vl(auVar53,auVar52,auVar49);
  auVar53 = vfmadd231ps_fma(auVar54,auVar52,auVar62);
  auVar52 = vfmadd231ps_avx512vl(auVar43,auVar51,auVar45);
  auVar55 = vfmadd231ps_avx512vl(auVar46,auVar51,auVar48);
  auVar51 = vfmadd231ps_fma(auVar53,auVar51,auVar56);
  auVar53 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
  auVar264 = ZEXT1664(auVar53);
  auVar56 = vandps_avx512vl(auVar44,auVar53);
  auVar227._8_4_ = 0x219392ef;
  auVar227._0_8_ = 0x219392ef219392ef;
  auVar227._12_4_ = 0x219392ef;
  uVar32 = vcmpps_avx512vl(auVar56,auVar227,1);
  bVar33 = (bool)((byte)uVar32 & 1);
  auVar38._0_4_ = (uint)bVar33 * 0x219392ef | (uint)!bVar33 * auVar44._0_4_;
  bVar33 = (bool)((byte)(uVar32 >> 1) & 1);
  auVar38._4_4_ = (uint)bVar33 * 0x219392ef | (uint)!bVar33 * auVar44._4_4_;
  bVar33 = (bool)((byte)(uVar32 >> 2) & 1);
  auVar38._8_4_ = (uint)bVar33 * 0x219392ef | (uint)!bVar33 * auVar44._8_4_;
  bVar33 = (bool)((byte)(uVar32 >> 3) & 1);
  auVar38._12_4_ = (uint)bVar33 * 0x219392ef | (uint)!bVar33 * auVar44._12_4_;
  auVar56 = vandps_avx512vl(auVar50,auVar53);
  uVar32 = vcmpps_avx512vl(auVar56,auVar227,1);
  bVar33 = (bool)((byte)uVar32 & 1);
  auVar57._0_4_ = (uint)bVar33 * 0x219392ef | (uint)!bVar33 * auVar50._0_4_;
  bVar33 = (bool)((byte)(uVar32 >> 1) & 1);
  auVar57._4_4_ = (uint)bVar33 * 0x219392ef | (uint)!bVar33 * auVar50._4_4_;
  bVar33 = (bool)((byte)(uVar32 >> 2) & 1);
  auVar57._8_4_ = (uint)bVar33 * 0x219392ef | (uint)!bVar33 * auVar50._8_4_;
  bVar33 = (bool)((byte)(uVar32 >> 3) & 1);
  auVar57._12_4_ = (uint)bVar33 * 0x219392ef | (uint)!bVar33 * auVar50._12_4_;
  auVar53 = vandps_avx512vl(auVar63,auVar53);
  uVar32 = vcmpps_avx512vl(auVar53,auVar227,1);
  bVar33 = (bool)((byte)uVar32 & 1);
  auVar64._0_4_ = (uint)bVar33 * 0x219392ef | (uint)!bVar33 * auVar63._0_4_;
  bVar33 = (bool)((byte)(uVar32 >> 1) & 1);
  auVar64._4_4_ = (uint)bVar33 * 0x219392ef | (uint)!bVar33 * auVar63._4_4_;
  bVar33 = (bool)((byte)(uVar32 >> 2) & 1);
  auVar64._8_4_ = (uint)bVar33 * 0x219392ef | (uint)!bVar33 * auVar63._8_4_;
  bVar33 = (bool)((byte)(uVar32 >> 3) & 1);
  auVar64._12_4_ = (uint)bVar33 * 0x219392ef | (uint)!bVar33 * auVar63._12_4_;
  auVar56 = vrcp14ps_avx512vl(auVar38);
  auVar228._8_4_ = 0x3f800000;
  auVar228._0_8_ = 0x3f8000003f800000;
  auVar228._12_4_ = 0x3f800000;
  auVar53 = vfnmadd213ps_fma(auVar38,auVar56,auVar228);
  auVar62 = vfmadd132ps_fma(auVar53,auVar56,auVar56);
  auVar56 = vrcp14ps_avx512vl(auVar57);
  auVar53 = vfnmadd213ps_fma(auVar57,auVar56,auVar228);
  auVar54 = vfmadd132ps_fma(auVar53,auVar56,auVar56);
  auVar56 = vrcp14ps_avx512vl(auVar64);
  auVar53 = vfnmadd213ps_fma(auVar64,auVar56,auVar228);
  auVar63 = vfmadd132ps_fma(auVar53,auVar56,auVar56);
  auVar133._4_4_ = fVar142;
  auVar133._0_4_ = fVar142;
  auVar133._8_4_ = fVar142;
  auVar133._12_4_ = fVar142;
  auVar53 = vcvtdq2ps_avx(auVar58);
  auVar56 = vcvtdq2ps_avx(auVar59);
  auVar56 = vsubps_avx(auVar56,auVar53);
  auVar44 = vfmadd213ps_fma(auVar56,auVar133,auVar53);
  auVar53 = vcvtdq2ps_avx(auVar60);
  auVar56 = vcvtdq2ps_avx(auVar61);
  auVar56 = vsubps_avx(auVar56,auVar53);
  auVar43 = vfmadd213ps_fma(auVar56,auVar133,auVar53);
  auVar56 = vcvtdq2ps_avx512vl(auVar40);
  auVar53 = vcvtdq2ps_avx512vl(auVar41);
  auVar53 = vsubps_avx(auVar53,auVar56);
  auVar50 = vfmadd213ps_fma(auVar53,auVar133,auVar56);
  auVar47 = vcvtdq2ps_avx512vl(auVar42);
  auVar45._8_8_ = 0;
  auVar45._0_8_ = *(ulong *)(prim + uVar26 * 0x18 + 6);
  auVar53 = vpmovsxwd_avx(auVar45);
  auVar53 = vcvtdq2ps_avx(auVar53);
  auVar56 = vsubps_avx(auVar53,auVar47);
  auVar46._8_8_ = 0;
  auVar46._0_8_ = *(ulong *)(prim + uVar26 * 0x1d + 6);
  auVar53 = vpmovsxwd_avx(auVar46);
  auVar45 = vfmadd213ps_fma(auVar56,auVar133,auVar47);
  auVar53 = vcvtdq2ps_avx(auVar53);
  auVar47._8_8_ = 0;
  auVar47._0_8_ = *(ulong *)(prim + uVar26 * 0x21 + 6);
  auVar56 = vpmovsxwd_avx(auVar47);
  auVar56 = vcvtdq2ps_avx(auVar56);
  auVar56 = vsubps_avx(auVar56,auVar53);
  auVar46 = vfmadd213ps_fma(auVar56,auVar133,auVar53);
  auVar48._8_8_ = 0;
  auVar48._0_8_ = *(ulong *)(prim + uVar26 * 0x1f + 6);
  auVar53 = vpmovsxwd_avx(auVar48);
  auVar53 = vcvtdq2ps_avx(auVar53);
  auVar49._8_8_ = 0;
  auVar49._0_8_ = *(ulong *)(prim + uVar26 * 0x23 + 6);
  auVar56 = vpmovsxwd_avx(auVar49);
  auVar56 = vcvtdq2ps_avx(auVar56);
  auVar56 = vsubps_avx(auVar56,auVar53);
  auVar56 = vfmadd213ps_fma(auVar56,auVar133,auVar53);
  auVar53 = vsubps_avx512vl(auVar44,auVar52);
  auVar61._0_4_ = auVar62._0_4_ * auVar53._0_4_;
  auVar61._4_4_ = auVar62._4_4_ * auVar53._4_4_;
  auVar61._8_4_ = auVar62._8_4_ * auVar53._8_4_;
  auVar61._12_4_ = auVar62._12_4_ * auVar53._12_4_;
  auVar53 = vsubps_avx512vl(auVar43,auVar52);
  auVar60._0_4_ = auVar62._0_4_ * auVar53._0_4_;
  auVar60._4_4_ = auVar62._4_4_ * auVar53._4_4_;
  auVar60._8_4_ = auVar62._8_4_ * auVar53._8_4_;
  auVar60._12_4_ = auVar62._12_4_ * auVar53._12_4_;
  auVar53 = vsubps_avx(auVar50,auVar55);
  auVar41._0_4_ = auVar54._0_4_ * auVar53._0_4_;
  auVar41._4_4_ = auVar54._4_4_ * auVar53._4_4_;
  auVar41._8_4_ = auVar54._8_4_ * auVar53._8_4_;
  auVar41._12_4_ = auVar54._12_4_ * auVar53._12_4_;
  auVar53 = vsubps_avx(auVar45,auVar55);
  auVar59._0_4_ = auVar54._0_4_ * auVar53._0_4_;
  auVar59._4_4_ = auVar54._4_4_ * auVar53._4_4_;
  auVar59._8_4_ = auVar54._8_4_ * auVar53._8_4_;
  auVar59._12_4_ = auVar54._12_4_ * auVar53._12_4_;
  auVar53 = vsubps_avx(auVar46,auVar51);
  auVar42._0_4_ = auVar63._0_4_ * auVar53._0_4_;
  auVar42._4_4_ = auVar63._4_4_ * auVar53._4_4_;
  auVar42._8_4_ = auVar63._8_4_ * auVar53._8_4_;
  auVar42._12_4_ = auVar63._12_4_ * auVar53._12_4_;
  auVar53 = vsubps_avx(auVar56,auVar51);
  auVar58._0_4_ = auVar63._0_4_ * auVar53._0_4_;
  auVar58._4_4_ = auVar63._4_4_ * auVar53._4_4_;
  auVar58._8_4_ = auVar63._8_4_ * auVar53._8_4_;
  auVar58._12_4_ = auVar63._12_4_ * auVar53._12_4_;
  auVar53 = vpminsd_avx(auVar61,auVar60);
  auVar56 = vpminsd_avx(auVar41,auVar59);
  auVar53 = vmaxps_avx(auVar53,auVar56);
  auVar56 = vpminsd_avx(auVar42,auVar58);
  uVar100 = *(undefined4 *)(ray + k * 4 + 0x60);
  auVar50._4_4_ = uVar100;
  auVar50._0_4_ = uVar100;
  auVar50._8_4_ = uVar100;
  auVar50._12_4_ = uVar100;
  auVar56 = vmaxps_avx512vl(auVar56,auVar50);
  auVar53 = vmaxps_avx(auVar53,auVar56);
  auVar51._8_4_ = 0x3f7ffffa;
  auVar51._0_8_ = 0x3f7ffffa3f7ffffa;
  auVar51._12_4_ = 0x3f7ffffa;
  local_3c0 = vmulps_avx512vl(auVar53,auVar51);
  auVar53 = vpmaxsd_avx(auVar61,auVar60);
  auVar56 = vpmaxsd_avx(auVar41,auVar59);
  auVar53 = vminps_avx(auVar53,auVar56);
  auVar56 = vpmaxsd_avx(auVar42,auVar58);
  uVar100 = *(undefined4 *)(ray + k * 4 + 0x100);
  auVar52._4_4_ = uVar100;
  auVar52._0_4_ = uVar100;
  auVar52._8_4_ = uVar100;
  auVar52._12_4_ = uVar100;
  auVar56 = vminps_avx512vl(auVar56,auVar52);
  auVar53 = vminps_avx(auVar53,auVar56);
  auVar55._8_4_ = 0x3f800003;
  auVar55._0_8_ = 0x3f8000033f800003;
  auVar55._12_4_ = 0x3f800003;
  auVar53 = vmulps_avx512vl(auVar53,auVar55);
  uVar18 = vcmpps_avx512vl(local_3c0,auVar53,2);
  uVar19 = vpcmpgtd_avx512vl(auVar39,_DAT_01f4ad30);
  uVar32 = CONCAT44((int)((ulong)prim >> 0x20),(uint)((byte)uVar18 & 0xf & (byte)uVar19));
  local_200 = vpmovm2d_avx512vl((ulong)(uint)(1 << ((uint)k & 0x1f)));
  auVar53 = vpxord_avx512vl(auVar40,auVar40);
  auVar259 = ZEXT1664(auVar53);
  auVar53 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
  auVar263 = ZEXT1664(auVar53);
LAB_01933c37:
  if (uVar32 == 0) {
LAB_01935c27:
    return uVar32 != 0;
  }
  lVar29 = 0;
  for (uVar26 = uVar32; (uVar26 & 1) == 0; uVar26 = uVar26 >> 1 | 0x8000000000000000) {
    lVar29 = lVar29 + 1;
  }
  uVar4 = *(uint *)(prim + 2);
  pGVar6 = (context->scene->geometries).items[uVar4].ptr;
  fVar142 = (pGVar6->time_range).lower;
  fVar142 = pGVar6->fnumTimeSegments *
            ((*(float *)(ray + k * 4 + 0xe0) - fVar142) / ((pGVar6->time_range).upper - fVar142));
  auVar53 = vroundss_avx(ZEXT416((uint)fVar142),ZEXT416((uint)fVar142),9);
  auVar53 = vminss_avx(auVar53,ZEXT416((uint)(pGVar6->fnumTimeSegments + -1.0)));
  auVar46 = vmaxss_avx512f(auVar259._0_16_,auVar53);
  uVar26 = (ulong)*(uint *)(*(long *)&pGVar6->field_0x58 +
                           (ulong)*(uint *)(prim + lVar29 * 4 + 6) *
                           pGVar6[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>.
                           _M_i);
  _Var7 = pGVar6[4].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
  lVar31 = (long)(int)auVar46._0_4_ * 0x38;
  lVar8 = *(long *)(_Var7 + 0x10 + lVar31);
  auVar53 = *(undefined1 (*) [16])(*(long *)(_Var7 + lVar31) + lVar8 * uVar26);
  lVar29 = uVar26 + 1;
  auVar56 = *(undefined1 (*) [16])(*(long *)(_Var7 + lVar31) + lVar8 * lVar29);
  p_Var9 = pGVar6[4].occlusionFilterN;
  lVar8 = *(long *)&pGVar6[4].fnumTimeSegments;
  lVar10 = *(long *)(lVar8 + 0x10 + lVar31);
  auVar62 = *(undefined1 (*) [16])(*(long *)(lVar8 + lVar31) + lVar10 * uVar26);
  auVar54 = *(undefined1 (*) [16])(*(long *)(lVar8 + lVar31) + lVar10 * lVar29);
  _Var11 = pGVar6[5].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
  lVar10 = *(long *)(_Var11 + 0x10 + lVar31);
  lVar12 = *(long *)(_Var7 + 0x38 + lVar31);
  lVar13 = *(long *)(_Var7 + 0x48 + lVar31);
  auVar63 = *(undefined1 (*) [16])(lVar12 + lVar13 * uVar26);
  auVar44 = *(undefined1 (*) [16])(lVar12 + lVar13 * lVar29);
  lVar12 = *(long *)(lVar8 + 0x38 + lVar31);
  lVar8 = *(long *)(lVar8 + 0x48 + lVar31);
  auVar43 = *(undefined1 (*) [16])(lVar12 + lVar8 * uVar26);
  auVar45 = *(undefined1 (*) [16])(lVar12 + lVar8 * lVar29);
  auVar67 = vpbroadcastd_avx512vl();
  local_1c0 = vmovdqa64_avx512vl(auVar67);
  lVar8 = *(long *)(_Var11 + 0x38 + lVar31);
  lVar12 = *(long *)(_Var11 + 0x48 + lVar31);
  auVar83._16_16_ = auVar67._16_16_;
  auVar48 = vsubss_avx512f(ZEXT416((uint)fVar142),auVar46);
  auVar49 = vbroadcastss_avx512vl(ZEXT416(0x3eaaaaab));
  auVar46 = vfmadd132ps_avx512vl
                      (*(undefined1 (*) [16])
                        (*(long *)(p_Var9 + lVar31) + *(long *)(p_Var9 + lVar31 + 0x10) * uVar26),
                       auVar53,auVar49);
  auVar47 = vfnmadd132ps_avx512vl
                      (*(undefined1 (*) [16])
                        (*(long *)(p_Var9 + lVar31) + *(long *)(p_Var9 + lVar31 + 0x10) * lVar29),
                       auVar56,auVar49);
  auVar50 = vfmadd132ps_avx512vl
                      (*(undefined1 (*) [16])(*(long *)(_Var11 + lVar31) + lVar10 * uVar26),auVar62,
                       auVar49);
  auVar51 = vfnmadd132ps_avx512vl
                      (*(undefined1 (*) [16])(*(long *)(_Var11 + lVar31) + lVar10 * lVar29),auVar54,
                       auVar49);
  auVar83._0_16_ = vxorps_avx512vl(in_ZMM28._0_16_,in_ZMM28._0_16_);
  auVar52 = vmulps_avx512vl(auVar56,auVar83._0_16_);
  auVar52 = vfmadd231ps_avx512vl(auVar52,auVar47,auVar83._0_16_);
  auVar55 = vpxord_avx512vl(auVar67._0_16_,auVar67._0_16_);
  auVar55 = vfmadd213ps_avx512vl(auVar55,auVar46,auVar52);
  auVar55 = vaddps_avx512vl(auVar53,auVar55);
  auVar41 = auVar263._0_16_;
  auVar52 = vfmadd231ps_avx512vl(auVar52,auVar46,auVar41);
  auVar52 = vfnmadd231ps_avx512vl(auVar52,auVar53,auVar41);
  auVar58 = vmulps_avx512vl(auVar54,auVar83._0_16_);
  auVar58 = vfmadd231ps_avx512vl(auVar58,auVar51,auVar83._0_16_);
  auVar59 = vpxord_avx512vl(auVar258._0_16_,auVar258._0_16_);
  auVar59 = vfmadd213ps_avx512vl(auVar59,auVar50,auVar58);
  auVar60 = vaddps_avx512vl(auVar62,auVar59);
  auVar58 = vfmadd231ps_avx512vl(auVar58,auVar50,auVar41);
  auVar58 = vfnmadd231ps_avx512vl(auVar58,auVar62,auVar41);
  auVar59 = vxorps_avx512vl(auVar59,auVar59);
  auVar59 = vfmadd213ps_avx512vl(auVar59,auVar47,auVar56);
  auVar59 = vfmadd231ps_avx512vl(auVar59,auVar46,auVar83._0_16_);
  auVar59 = vfmadd231ps_avx512vl(auVar59,auVar53,auVar83._0_16_);
  auVar56 = vmulps_avx512vl(auVar56,auVar41);
  auVar56 = vfnmadd231ps_avx512vl(auVar56,auVar41,auVar47);
  auVar56 = vfmadd231ps_avx512vl(auVar56,auVar83._0_16_,auVar46);
  auVar61 = vfnmadd231ps_avx512vl(auVar56,auVar83._0_16_,auVar53);
  auVar53 = vfmadd213ps_fma(ZEXT816(0) << 0x20,auVar51,auVar54);
  auVar53 = vfmadd231ps_avx512vl(auVar53,auVar50,auVar83._0_16_);
  auVar56 = vfmadd231ps_avx512vl(auVar53,auVar62,auVar83._0_16_);
  auVar53 = vmulps_avx512vl(auVar54,auVar41);
  auVar53 = vfnmadd231ps_avx512vl(auVar53,auVar41,auVar51);
  auVar53 = vfmadd231ps_avx512vl(auVar53,auVar83._0_16_,auVar50);
  auVar47 = vfnmadd231ps_avx512vl(auVar53,auVar83._0_16_,auVar62);
  auVar53 = vshufps_avx(auVar52,auVar52,0xc9);
  auVar62 = vshufps_avx512vl(auVar60,auVar60,0xc9);
  fVar221 = auVar52._0_4_;
  auVar143._0_4_ = fVar221 * auVar62._0_4_;
  fVar132 = auVar52._4_4_;
  auVar143._4_4_ = fVar132 * auVar62._4_4_;
  fVar140 = auVar52._8_4_;
  auVar143._8_4_ = fVar140 * auVar62._8_4_;
  fVar141 = auVar52._12_4_;
  auVar143._12_4_ = fVar141 * auVar62._12_4_;
  auVar62 = vfmsub231ps_avx512vl(auVar143,auVar53,auVar60);
  auVar62 = vshufps_avx(auVar62,auVar62,0xc9);
  auVar54 = vshufps_avx512vl(auVar58,auVar58,0xc9);
  auVar160._0_4_ = fVar221 * auVar54._0_4_;
  auVar160._4_4_ = fVar132 * auVar54._4_4_;
  auVar160._8_4_ = fVar140 * auVar54._8_4_;
  auVar160._12_4_ = fVar141 * auVar54._12_4_;
  auVar53 = vfmsub231ps_avx512vl(auVar160,auVar53,auVar58);
  auVar54 = vshufps_avx(auVar53,auVar53,0xc9);
  auVar50 = vshufps_avx512vl(auVar61,auVar61,0xc9);
  auVar53 = vshufps_avx(auVar56,auVar56,0xc9);
  auVar53 = vmulps_avx512vl(auVar61,auVar53);
  auVar53 = vfmsub231ps_fma(auVar53,auVar50,auVar56);
  auVar46 = vshufps_avx(auVar53,auVar53,0xc9);
  auVar53 = vshufps_avx(auVar47,auVar47,0xc9);
  auVar53 = vmulps_avx512vl(auVar61,auVar53);
  auVar53 = vfmsub231ps_fma(auVar53,auVar50,auVar47);
  auVar47 = vshufps_avx(auVar53,auVar53,0xc9);
  auVar53 = vdpps_avx(auVar62,auVar62,0x7f);
  auVar67._4_28_ = auVar83._4_28_;
  auVar67._0_4_ = auVar53._0_4_;
  auVar56 = vrsqrt14ss_avx512f(auVar83._0_16_,auVar67._0_16_);
  auVar50 = vmulss_avx512f(auVar56,ZEXT416(0x3fc00000));
  auVar51 = vmulss_avx512f(auVar53,ZEXT416(0x3f000000));
  auVar51 = vmulss_avx512f(auVar51,auVar56);
  auVar56 = vmulss_avx512f(auVar51,ZEXT416((uint)(auVar56._0_4_ * auVar56._0_4_)));
  fVar209 = auVar50._0_4_ - auVar56._0_4_;
  auVar181._4_4_ = fVar209;
  auVar181._0_4_ = fVar209;
  auVar181._8_4_ = fVar209;
  auVar181._12_4_ = fVar209;
  auVar56 = vdpps_avx(auVar62,auVar54,0x7f);
  auVar50 = vmulps_avx512vl(auVar62,auVar181);
  auVar51 = vbroadcastss_avx512vl(auVar53);
  auVar54 = vmulps_avx512vl(auVar51,auVar54);
  fVar142 = auVar56._0_4_;
  auVar144._0_4_ = fVar142 * auVar62._0_4_;
  auVar144._4_4_ = fVar142 * auVar62._4_4_;
  auVar144._8_4_ = fVar142 * auVar62._8_4_;
  auVar144._12_4_ = fVar142 * auVar62._12_4_;
  auVar62 = vsubps_avx(auVar54,auVar144);
  auVar56 = vrcp14ss_avx512f(auVar83._0_16_,auVar67._0_16_);
  auVar53 = vfnmadd213ss_avx512f(auVar53,auVar56,ZEXT416(0x40000000));
  fVar142 = auVar56._0_4_ * auVar53._0_4_;
  auVar53 = vdpps_avx(auVar46,auVar46,0x7f);
  auVar68._16_16_ = auVar83._16_16_;
  auVar68._0_16_ = auVar83._0_16_;
  auVar85._4_28_ = auVar68._4_28_;
  auVar85._0_4_ = auVar53._0_4_;
  auVar56 = vrsqrt14ss_avx512f(auVar83._0_16_,auVar85._0_16_);
  auVar54 = vmulss_avx512f(auVar56,ZEXT416(0x3fc00000));
  auVar51 = vmulss_avx512f(auVar53,ZEXT416(0x3f000000));
  fVar225 = auVar56._0_4_;
  fVar220 = auVar54._0_4_ - auVar51._0_4_ * fVar225 * fVar225 * fVar225;
  auVar182._0_4_ = auVar46._0_4_ * fVar220;
  auVar182._4_4_ = auVar46._4_4_ * fVar220;
  auVar182._8_4_ = auVar46._8_4_ * fVar220;
  auVar182._12_4_ = auVar46._12_4_ * fVar220;
  auVar56 = vdpps_avx(auVar46,auVar47,0x7f);
  auVar54 = vbroadcastss_avx512vl(auVar53);
  auVar54 = vmulps_avx512vl(auVar54,auVar47);
  fVar225 = auVar56._0_4_;
  auVar40._0_4_ = fVar225 * auVar46._0_4_;
  auVar40._4_4_ = fVar225 * auVar46._4_4_;
  auVar40._8_4_ = fVar225 * auVar46._8_4_;
  auVar40._12_4_ = fVar225 * auVar46._12_4_;
  auVar56 = vsubps_avx(auVar54,auVar40);
  auVar54 = vrcp14ss_avx512f(auVar83._0_16_,auVar85._0_16_);
  auVar53 = vfnmadd213ss_avx512f(auVar53,auVar54,ZEXT416(0x40000000));
  fVar225 = auVar54._0_4_ * auVar53._0_4_;
  auVar54 = vshufps_avx512vl(auVar55,auVar55,0xff);
  auVar46 = vmulps_avx512vl(auVar54,auVar50);
  auVar47 = vsubps_avx512vl(auVar55,auVar46);
  auVar53 = vshufps_avx(auVar52,auVar52,0xff);
  auVar53 = vmulps_avx512vl(auVar53,auVar50);
  auVar120._0_4_ = auVar53._0_4_ + auVar54._0_4_ * fVar209 * fVar142 * auVar62._0_4_;
  auVar120._4_4_ = auVar53._4_4_ + auVar54._4_4_ * fVar209 * fVar142 * auVar62._4_4_;
  auVar120._8_4_ = auVar53._8_4_ + auVar54._8_4_ * fVar209 * fVar142 * auVar62._8_4_;
  auVar120._12_4_ = auVar53._12_4_ + auVar54._12_4_ * fVar209 * fVar142 * auVar62._12_4_;
  auVar53 = vsubps_avx(auVar52,auVar120);
  auVar50 = vaddps_avx512vl(auVar55,auVar46);
  auVar161._0_4_ = fVar221 + auVar120._0_4_;
  auVar161._4_4_ = fVar132 + auVar120._4_4_;
  auVar161._8_4_ = fVar140 + auVar120._8_4_;
  auVar161._12_4_ = fVar141 + auVar120._12_4_;
  auVar62 = vshufps_avx512vl(auVar59,auVar59,0xff);
  auVar190._0_4_ = auVar182._0_4_ * auVar62._0_4_;
  auVar190._4_4_ = auVar182._4_4_ * auVar62._4_4_;
  auVar190._8_4_ = auVar182._8_4_ * auVar62._8_4_;
  auVar190._12_4_ = auVar182._12_4_ * auVar62._12_4_;
  auVar51 = vsubps_avx512vl(auVar59,auVar190);
  auVar54 = vshufps_avx512vl(auVar61,auVar61,0xff);
  auVar46 = vmulps_avx512vl(auVar54,auVar182);
  auVar145._0_4_ = auVar46._0_4_ + auVar62._0_4_ * fVar220 * auVar56._0_4_ * fVar225;
  auVar145._4_4_ = auVar46._4_4_ + auVar62._4_4_ * fVar220 * auVar56._4_4_ * fVar225;
  auVar145._8_4_ = auVar46._8_4_ + auVar62._8_4_ * fVar220 * auVar56._8_4_ * fVar225;
  auVar145._12_4_ = auVar46._12_4_ + auVar62._12_4_ * fVar220 * auVar56._12_4_ * fVar225;
  auVar56 = vsubps_avx512vl(auVar61,auVar145);
  auVar52 = vaddps_avx512vl(auVar59,auVar190);
  auVar62 = vaddps_avx512vl(auVar61,auVar145);
  auVar53 = vmulps_avx512vl(auVar53,auVar49);
  auVar171._0_4_ = auVar47._0_4_ + auVar53._0_4_;
  auVar171._4_4_ = auVar47._4_4_ + auVar53._4_4_;
  auVar171._8_4_ = auVar47._8_4_ + auVar53._8_4_;
  auVar171._12_4_ = auVar47._12_4_ + auVar53._12_4_;
  auVar53 = vmulps_avx512vl(auVar56,auVar49);
  auVar46 = vsubps_avx(auVar51,auVar53);
  auVar53 = vmulps_avx512vl(auVar161,auVar49);
  auVar55 = vaddps_avx512vl(auVar50,auVar53);
  auVar53 = vmulps_avx512vl(auVar62,auVar49);
  auVar58 = vsubps_avx512vl(auVar52,auVar53);
  auVar53 = vfmadd132ps_avx512vl
                      (*(undefined1 (*) [16])
                        (*(long *)(p_Var9 + lVar31 + 0x38) +
                        *(long *)(p_Var9 + lVar31 + 0x48) * uVar26),auVar63,auVar49);
  auVar56 = vfnmadd132ps_avx512vl
                      (*(undefined1 (*) [16])
                        (*(long *)(p_Var9 + lVar31 + 0x38) +
                        *(long *)(p_Var9 + lVar31 + 0x48) * lVar29),auVar44,auVar49);
  auVar62 = vfmadd132ps_avx512vl(*(undefined1 (*) [16])(lVar8 + uVar26 * lVar12),auVar43,auVar49);
  auVar60 = vfnmadd132ps_avx512vl(*(undefined1 (*) [16])(lVar8 + lVar12 * lVar29),auVar45,auVar49);
  auVar61 = vmulps_avx512vl(auVar44,auVar83._0_16_);
  auVar61 = vfmadd231ps_avx512vl(auVar61,auVar56,auVar83._0_16_);
  auVar54 = vxorps_avx512vl(auVar54,auVar54);
  auVar54 = vfmadd213ps_avx512vl(auVar54,auVar53,auVar61);
  auVar38 = vaddps_avx512vl(auVar63,auVar54);
  auVar54 = vfmadd231ps_avx512vl(auVar61,auVar53,auVar41);
  auVar61 = vfnmadd231ps_avx512vl(auVar54,auVar63,auVar41);
  auVar54 = vmulps_avx512vl(auVar45,auVar83._0_16_);
  auVar54 = vfmadd231ps_avx512vl(auVar54,auVar60,auVar83._0_16_);
  auVar59 = vxorps_avx512vl(auVar59,auVar59);
  auVar59 = vfmadd213ps_avx512vl(auVar59,auVar62,auVar54);
  auVar39 = vaddps_avx512vl(auVar43,auVar59);
  auVar54 = vfmadd231ps_avx512vl(auVar54,auVar62,auVar41);
  auVar54 = vfnmadd231ps_avx512vl(auVar54,auVar43,auVar41);
  auVar59 = vxorps_avx512vl(auVar59,auVar59);
  auVar59 = vfmadd213ps_avx512vl(auVar59,auVar56,auVar44);
  auVar59 = vfmadd231ps_avx512vl(auVar59,auVar53,auVar83._0_16_);
  auVar59 = vfmadd231ps_avx512vl(auVar59,auVar63,auVar83._0_16_);
  auVar44 = vmulps_avx512vl(auVar44,auVar41);
  auVar56 = vfnmadd231ps_avx512vl(auVar44,auVar41,auVar56);
  auVar53 = vfmadd231ps_avx512vl(auVar56,auVar83._0_16_,auVar53);
  auVar63 = vfnmadd231ps_avx512vl(auVar53,auVar83._0_16_,auVar63);
  auVar53 = vfmadd213ps_avx512vl(ZEXT816(0) << 0x20,auVar60,auVar45);
  auVar53 = vfmadd231ps_avx512vl(auVar53,auVar62,auVar83._0_16_);
  auVar44 = vfmadd231ps_avx512vl(auVar53,auVar43,auVar83._0_16_);
  auVar53 = vmulps_avx512vl(auVar45,auVar41);
  auVar53 = vfnmadd231ps_avx512vl(auVar53,auVar41,auVar60);
  auVar53 = vfmadd231ps_avx512vl(auVar53,auVar83._0_16_,auVar62);
  auVar43 = vfnmadd231ps_avx512vl(auVar53,auVar83._0_16_,auVar43);
  auVar53 = vshufps_avx(auVar61,auVar61,0xc9);
  auVar56 = vshufps_avx512vl(auVar39,auVar39,0xc9);
  fVar209 = auVar61._0_4_;
  auVar242._0_4_ = fVar209 * auVar56._0_4_;
  fVar220 = auVar61._4_4_;
  auVar242._4_4_ = fVar220 * auVar56._4_4_;
  fVar221 = auVar61._8_4_;
  auVar242._8_4_ = fVar221 * auVar56._8_4_;
  fVar132 = auVar61._12_4_;
  auVar242._12_4_ = fVar132 * auVar56._12_4_;
  auVar56 = vfmsub231ps_avx512vl(auVar242,auVar53,auVar39);
  auVar62 = vshufps_avx(auVar56,auVar56,0xc9);
  auVar56 = vshufps_avx512vl(auVar54,auVar54,0xc9);
  auVar250._0_4_ = fVar209 * auVar56._0_4_;
  auVar250._4_4_ = fVar220 * auVar56._4_4_;
  auVar250._8_4_ = fVar221 * auVar56._8_4_;
  auVar250._12_4_ = fVar132 * auVar56._12_4_;
  auVar53 = vfmsub231ps_avx512vl(auVar250,auVar53,auVar54);
  auVar54 = vshufps_avx(auVar53,auVar53,0xc9);
  auVar56 = vshufps_avx(auVar63,auVar63,0xc9);
  auVar53 = vshufps_avx512vl(auVar44,auVar44,0xc9);
  auVar53 = vmulps_avx512vl(auVar63,auVar53);
  auVar53 = vfmsub231ps_avx512vl(auVar53,auVar56,auVar44);
  auVar44 = vshufps_avx512vl(auVar53,auVar53,0xc9);
  auVar45 = vshufps_avx512vl(auVar43,auVar43,0xc9);
  auVar53 = vdpps_avx(auVar62,auVar62,0x7f);
  auVar45 = vmulps_avx512vl(auVar63,auVar45);
  auVar56 = vfmsub231ps_avx512vl(auVar45,auVar56,auVar43);
  auVar43 = vshufps_avx512vl(auVar56,auVar56,0xc9);
  auVar69._16_16_ = auVar83._16_16_;
  auVar69._0_16_ = auVar83._0_16_;
  auVar70._4_28_ = auVar69._4_28_;
  auVar70._0_4_ = auVar53._0_4_;
  auVar56 = vrsqrt14ss_avx512f(auVar83._0_16_,auVar70._0_16_);
  auVar45 = vmulss_avx512f(auVar56,ZEXT416(0x3fc00000));
  auVar60 = vmulss_avx512f(auVar53,ZEXT416(0x3f000000));
  auVar60 = vmulss_avx512f(auVar60,auVar56);
  auVar56 = vmulss_avx512f(auVar56,auVar56);
  auVar56 = vmulss_avx512f(auVar60,auVar56);
  auVar56 = vsubss_avx512f(auVar45,auVar56);
  auVar45 = vbroadcastss_avx512vl(auVar56);
  auVar60 = vmulps_avx512vl(auVar62,auVar45);
  auVar56 = vdpps_avx(auVar62,auVar54,0x7f);
  auVar39 = vbroadcastss_avx512vl(auVar53);
  auVar54 = vmulps_avx512vl(auVar39,auVar54);
  fVar142 = auVar56._0_4_;
  auVar146._0_4_ = auVar62._0_4_ * fVar142;
  auVar146._4_4_ = auVar62._4_4_ * fVar142;
  auVar146._8_4_ = auVar62._8_4_ * fVar142;
  auVar146._12_4_ = auVar62._12_4_ * fVar142;
  auVar56 = vsubps_avx(auVar54,auVar146);
  auVar62 = vrcp14ss_avx512f(auVar83._0_16_,auVar70._0_16_);
  auVar53 = vfnmadd213ss_avx512f(auVar53,auVar62,ZEXT416(0x40000000));
  fVar142 = auVar62._0_4_ * auVar53._0_4_;
  auVar53 = vdpps_avx(auVar44,auVar44,0x7f);
  auVar106._0_4_ = fVar142 * auVar56._0_4_;
  auVar106._4_4_ = fVar142 * auVar56._4_4_;
  auVar106._8_4_ = fVar142 * auVar56._8_4_;
  auVar106._12_4_ = fVar142 * auVar56._12_4_;
  auVar62 = vmulps_avx512vl(auVar45,auVar106);
  auVar71._16_16_ = auVar83._16_16_;
  auVar71._0_16_ = auVar83._0_16_;
  auVar72._4_28_ = auVar71._4_28_;
  auVar72._0_4_ = auVar53._0_4_;
  auVar56 = vrsqrt14ss_avx512f(auVar83._0_16_,auVar72._0_16_);
  auVar54 = vmulss_avx512f(auVar56,ZEXT416(0x3fc00000));
  auVar39 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
  auVar266 = ZEXT1664(auVar39);
  auVar45 = vmulss_avx512f(auVar53,ZEXT416(0x3f000000));
  auVar265 = ZEXT464(0x3f800000);
  auVar45 = vmulss_avx512f(auVar45,auVar56);
  auVar56 = vmulss_avx512f(auVar45,ZEXT416((uint)(auVar56._0_4_ * auVar56._0_4_)));
  fVar225 = auVar54._0_4_ - auVar56._0_4_;
  auVar251._0_4_ = auVar44._0_4_ * fVar225;
  auVar251._4_4_ = auVar44._4_4_ * fVar225;
  auVar251._8_4_ = auVar44._8_4_ * fVar225;
  auVar251._12_4_ = auVar44._12_4_ * fVar225;
  auVar56 = vdpps_avx(auVar44,auVar43,0x7f);
  auVar54 = vbroadcastss_avx512vl(auVar53);
  auVar54 = vmulps_avx512vl(auVar54,auVar43);
  fVar142 = auVar56._0_4_;
  auVar162._0_4_ = auVar44._0_4_ * fVar142;
  auVar162._4_4_ = auVar44._4_4_ * fVar142;
  auVar162._8_4_ = auVar44._8_4_ * fVar142;
  auVar162._12_4_ = auVar44._12_4_ * fVar142;
  auVar56 = vsubps_avx(auVar54,auVar162);
  auVar54 = vrcp14ss_avx512f(auVar83._0_16_,auVar72._0_16_);
  auVar53 = vfnmadd213ss_avx512f(auVar53,auVar54,ZEXT416(0x40000000));
  fVar142 = auVar53._0_4_ * auVar54._0_4_;
  auVar54 = vshufps_avx512vl(auVar38,auVar38,0xff);
  auVar44 = vmulps_avx512vl(auVar54,auVar60);
  auVar43 = vsubps_avx512vl(auVar38,auVar44);
  auVar53 = vshufps_avx(auVar61,auVar61,0xff);
  auVar53 = vmulps_avx512vl(auVar53,auVar60);
  auVar107._0_4_ = auVar53._0_4_ + auVar54._0_4_ * auVar62._0_4_;
  auVar107._4_4_ = auVar53._4_4_ + auVar54._4_4_ * auVar62._4_4_;
  auVar107._8_4_ = auVar53._8_4_ + auVar54._8_4_ * auVar62._8_4_;
  auVar107._12_4_ = auVar53._12_4_ + auVar54._12_4_ * auVar62._12_4_;
  auVar53 = vsubps_avx(auVar61,auVar107);
  auVar62 = vaddps_avx512vl(auVar38,auVar44);
  auVar108._0_4_ = fVar209 + auVar107._0_4_;
  auVar108._4_4_ = fVar220 + auVar107._4_4_;
  auVar108._8_4_ = fVar221 + auVar107._8_4_;
  auVar108._12_4_ = fVar132 + auVar107._12_4_;
  auVar54 = vshufps_avx512vl(auVar59,auVar59,0xff);
  auVar237._0_4_ = auVar54._0_4_ * auVar251._0_4_;
  auVar237._4_4_ = auVar54._4_4_ * auVar251._4_4_;
  auVar237._8_4_ = auVar54._8_4_ * auVar251._8_4_;
  auVar237._12_4_ = auVar54._12_4_ * auVar251._12_4_;
  auVar44 = vsubps_avx512vl(auVar59,auVar237);
  auVar45 = vshufps_avx512vl(auVar63,auVar63,0xff);
  auVar45 = vmulps_avx512vl(auVar45,auVar251);
  auVar147._0_4_ = auVar45._0_4_ + auVar54._0_4_ * fVar225 * auVar56._0_4_ * fVar142;
  auVar147._4_4_ = auVar45._4_4_ + auVar54._4_4_ * fVar225 * auVar56._4_4_ * fVar142;
  auVar147._8_4_ = auVar45._8_4_ + auVar54._8_4_ * fVar225 * auVar56._8_4_ * fVar142;
  auVar147._12_4_ = auVar45._12_4_ + auVar54._12_4_ * fVar225 * auVar56._12_4_ * fVar142;
  auVar56 = vsubps_avx(auVar63,auVar147);
  auVar54 = vaddps_avx512vl(auVar59,auVar237);
  auVar148._0_4_ = auVar63._0_4_ + auVar147._0_4_;
  auVar148._4_4_ = auVar63._4_4_ + auVar147._4_4_;
  auVar148._8_4_ = auVar63._8_4_ + auVar147._8_4_;
  auVar148._12_4_ = auVar63._12_4_ + auVar147._12_4_;
  auVar53 = vmulps_avx512vl(auVar53,auVar49);
  auVar163._0_4_ = auVar43._0_4_ + auVar53._0_4_;
  auVar163._4_4_ = auVar43._4_4_ + auVar53._4_4_;
  auVar163._8_4_ = auVar43._8_4_ + auVar53._8_4_;
  auVar163._12_4_ = auVar43._12_4_ + auVar53._12_4_;
  auVar53 = vmulps_avx512vl(auVar56,auVar49);
  auVar53 = vsubps_avx(auVar44,auVar53);
  auVar56 = vmulps_avx512vl(auVar108,auVar49);
  auVar109._0_4_ = auVar62._0_4_ + auVar56._0_4_;
  auVar109._4_4_ = auVar62._4_4_ + auVar56._4_4_;
  auVar109._8_4_ = auVar62._8_4_ + auVar56._8_4_;
  auVar109._12_4_ = auVar62._12_4_ + auVar56._12_4_;
  auVar56 = vmulps_avx512vl(auVar148,auVar49);
  auVar56 = vsubps_avx(auVar54,auVar56);
  auVar63 = vbroadcastss_avx512vl(auVar48);
  auVar45 = vsubss_avx512f(ZEXT416(0x3f800000),auVar48);
  auVar252._0_4_ = auVar45._0_4_;
  auVar252._4_4_ = auVar252._0_4_;
  auVar252._8_4_ = auVar252._0_4_;
  auVar252._12_4_ = auVar252._0_4_;
  auVar43 = vmulps_avx512vl(auVar63,auVar43);
  auVar45 = vmulps_avx512vl(auVar63,auVar163);
  auVar53 = vmulps_avx512vl(auVar63,auVar53);
  auVar243._0_4_ = auVar63._0_4_ * auVar44._0_4_;
  auVar243._4_4_ = auVar63._4_4_ * auVar44._4_4_;
  auVar243._8_4_ = auVar63._8_4_ * auVar44._8_4_;
  auVar243._12_4_ = auVar63._12_4_ * auVar44._12_4_;
  local_340 = vfmadd231ps_avx512vl(auVar43,auVar252,auVar47);
  local_350 = vfmadd231ps_avx512vl(auVar45,auVar252,auVar171);
  local_360 = vfmadd231ps_avx512vl(auVar53,auVar252,auVar46);
  local_370 = vfmadd231ps_fma(auVar243,auVar252,auVar51);
  auVar53 = vmulps_avx512vl(auVar63,auVar62);
  auVar62 = vmulps_avx512vl(auVar63,auVar109);
  auVar56 = vmulps_avx512vl(auVar63,auVar56);
  auVar238._0_4_ = auVar63._0_4_ * auVar54._0_4_;
  auVar238._4_4_ = auVar63._4_4_ * auVar54._4_4_;
  auVar238._8_4_ = auVar63._8_4_ * auVar54._8_4_;
  auVar238._12_4_ = auVar63._12_4_ * auVar54._12_4_;
  _local_380 = vfmadd231ps_avx512vl(auVar53,auVar252,auVar50);
  _local_390 = vfmadd231ps_avx512vl(auVar62,auVar252,auVar55);
  _local_3a0 = vfmadd231ps_avx512vl(auVar56,auVar252,auVar58);
  _local_3b0 = vfmadd231ps_fma(auVar238,auVar252,auVar52);
  auVar53 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x20)),
                          0x1c);
  auVar53 = vinsertps_avx(auVar53,ZEXT416(*(uint *)(ray + k * 4 + 0x40)),0x28);
  local_2c0 = vsubps_avx512vl(local_340,auVar53);
  uVar100 = local_2c0._0_4_;
  auVar110._4_4_ = uVar100;
  auVar110._0_4_ = uVar100;
  auVar110._8_4_ = uVar100;
  auVar110._12_4_ = uVar100;
  auVar56 = vshufps_avx(local_2c0,local_2c0,0x55);
  auVar62 = vshufps_avx(local_2c0,local_2c0,0xaa);
  aVar2 = pre->ray_space[k].vx.field_0;
  aVar3 = pre->ray_space[k].vy.field_0;
  fVar142 = pre->ray_space[k].vz.field_0.m128[0];
  fVar225 = pre->ray_space[k].vz.field_0.m128[1];
  fVar209 = pre->ray_space[k].vz.field_0.m128[2];
  fVar220 = pre->ray_space[k].vz.field_0.m128[3];
  auVar101._0_4_ = fVar142 * auVar62._0_4_;
  auVar101._4_4_ = fVar225 * auVar62._4_4_;
  auVar101._8_4_ = fVar209 * auVar62._8_4_;
  auVar101._12_4_ = fVar220 * auVar62._12_4_;
  auVar56 = vfmadd231ps_fma(auVar101,(undefined1  [16])aVar3,auVar56);
  auVar43 = vfmadd231ps_fma(auVar56,(undefined1  [16])aVar2,auVar110);
  local_2d0 = vsubps_avx512vl(local_350,auVar53);
  uVar100 = local_2d0._0_4_;
  auVar121._4_4_ = uVar100;
  auVar121._0_4_ = uVar100;
  auVar121._8_4_ = uVar100;
  auVar121._12_4_ = uVar100;
  auVar56 = vshufps_avx(local_2d0,local_2d0,0x55);
  auVar62 = vshufps_avx(local_2d0,local_2d0,0xaa);
  auVar111._0_4_ = fVar142 * auVar62._0_4_;
  auVar111._4_4_ = fVar225 * auVar62._4_4_;
  auVar111._8_4_ = fVar209 * auVar62._8_4_;
  auVar111._12_4_ = fVar220 * auVar62._12_4_;
  auVar56 = vfmadd231ps_fma(auVar111,(undefined1  [16])aVar3,auVar56);
  auVar45 = vfmadd231ps_fma(auVar56,(undefined1  [16])aVar2,auVar121);
  local_2e0 = vsubps_avx512vl(local_360,auVar53);
  uVar100 = local_2e0._0_4_;
  auVar122._4_4_ = uVar100;
  auVar122._0_4_ = uVar100;
  auVar122._8_4_ = uVar100;
  auVar122._12_4_ = uVar100;
  auVar56 = vshufps_avx(local_2e0,local_2e0,0x55);
  auVar62 = vshufps_avx(local_2e0,local_2e0,0xaa);
  auVar183._0_4_ = auVar62._0_4_ * fVar142;
  auVar183._4_4_ = auVar62._4_4_ * fVar225;
  auVar183._8_4_ = auVar62._8_4_ * fVar209;
  auVar183._12_4_ = auVar62._12_4_ * fVar220;
  auVar56 = vfmadd231ps_fma(auVar183,(undefined1  [16])aVar3,auVar56);
  auVar46 = vfmadd231ps_fma(auVar56,(undefined1  [16])aVar2,auVar122);
  local_2f0 = vsubps_avx(local_370,auVar53);
  uVar100 = local_2f0._0_4_;
  auVar123._4_4_ = uVar100;
  auVar123._0_4_ = uVar100;
  auVar123._8_4_ = uVar100;
  auVar123._12_4_ = uVar100;
  auVar56 = vshufps_avx(local_2f0,local_2f0,0x55);
  auVar62 = vshufps_avx(local_2f0,local_2f0,0xaa);
  auVar191._0_4_ = auVar62._0_4_ * fVar142;
  auVar191._4_4_ = auVar62._4_4_ * fVar225;
  auVar191._8_4_ = auVar62._8_4_ * fVar209;
  auVar191._12_4_ = auVar62._12_4_ * fVar220;
  auVar56 = vfmadd231ps_fma(auVar191,(undefined1  [16])aVar3,auVar56);
  auVar47 = vfmadd231ps_fma(auVar56,(undefined1  [16])aVar2,auVar123);
  local_300 = vsubps_avx512vl(_local_380,auVar53);
  uVar100 = local_300._0_4_;
  auVar124._4_4_ = uVar100;
  auVar124._0_4_ = uVar100;
  auVar124._8_4_ = uVar100;
  auVar124._12_4_ = uVar100;
  auVar56 = vshufps_avx(local_300,local_300,0x55);
  auVar62 = vshufps_avx(local_300,local_300,0xaa);
  auVar202._0_4_ = auVar62._0_4_ * fVar142;
  auVar202._4_4_ = auVar62._4_4_ * fVar225;
  auVar202._8_4_ = auVar62._8_4_ * fVar209;
  auVar202._12_4_ = auVar62._12_4_ * fVar220;
  auVar56 = vfmadd231ps_fma(auVar202,(undefined1  [16])aVar3,auVar56);
  auVar48 = vfmadd231ps_fma(auVar56,(undefined1  [16])aVar2,auVar124);
  local_310 = vsubps_avx512vl(_local_390,auVar53);
  uVar100 = local_310._0_4_;
  auVar125._4_4_ = uVar100;
  auVar125._0_4_ = uVar100;
  auVar125._8_4_ = uVar100;
  auVar125._12_4_ = uVar100;
  auVar56 = vshufps_avx(local_310,local_310,0x55);
  auVar62 = vshufps_avx(local_310,local_310,0xaa);
  auVar210._0_4_ = auVar62._0_4_ * fVar142;
  auVar210._4_4_ = auVar62._4_4_ * fVar225;
  auVar210._8_4_ = auVar62._8_4_ * fVar209;
  auVar210._12_4_ = auVar62._12_4_ * fVar220;
  auVar56 = vfmadd231ps_fma(auVar210,(undefined1  [16])aVar3,auVar56);
  auVar49 = vfmadd231ps_fma(auVar56,(undefined1  [16])aVar2,auVar125);
  local_320 = vsubps_avx512vl(_local_3a0,auVar53);
  uVar100 = local_320._0_4_;
  auVar126._4_4_ = uVar100;
  auVar126._0_4_ = uVar100;
  auVar126._8_4_ = uVar100;
  auVar126._12_4_ = uVar100;
  auVar56 = vshufps_avx(local_320,local_320,0x55);
  auVar62 = vshufps_avx(local_320,local_320,0xaa);
  auVar229._0_4_ = auVar62._0_4_ * fVar142;
  auVar229._4_4_ = auVar62._4_4_ * fVar225;
  auVar229._8_4_ = auVar62._8_4_ * fVar209;
  auVar229._12_4_ = auVar62._12_4_ * fVar220;
  auVar56 = vfmadd231ps_fma(auVar229,(undefined1  [16])aVar3,auVar56);
  auVar50 = vfmadd231ps_fma(auVar56,(undefined1  [16])aVar2,auVar126);
  local_330 = vsubps_avx(_local_3b0,auVar53);
  uVar100 = local_330._0_4_;
  auVar113._4_4_ = uVar100;
  auVar113._0_4_ = uVar100;
  auVar113._8_4_ = uVar100;
  auVar113._12_4_ = uVar100;
  auVar53 = vshufps_avx(local_330,local_330,0x55);
  auVar56 = vshufps_avx(local_330,local_330,0xaa);
  auVar164._0_4_ = fVar142 * auVar56._0_4_;
  auVar164._4_4_ = fVar225 * auVar56._4_4_;
  auVar164._8_4_ = fVar209 * auVar56._8_4_;
  auVar164._12_4_ = fVar220 * auVar56._12_4_;
  auVar53 = vfmadd231ps_fma(auVar164,(undefined1  [16])aVar3,auVar53);
  auVar51 = vfmadd231ps_fma(auVar53,(undefined1  [16])aVar2,auVar113);
  auVar62 = vmovlhps_avx(auVar43,auVar48);
  auVar54 = vmovlhps_avx(auVar45,auVar49);
  auVar63 = vmovlhps_avx(auVar46,auVar50);
  _local_2a0 = vmovlhps_avx512f(auVar47,auVar51);
  auVar56 = vminps_avx(auVar62,auVar54);
  auVar53 = vmaxps_avx(auVar62,auVar54);
  auVar44 = vminps_avx512vl(auVar63,_local_2a0);
  auVar56 = vminps_avx(auVar56,auVar44);
  auVar44 = vmaxps_avx512vl(auVar63,_local_2a0);
  auVar53 = vmaxps_avx(auVar53,auVar44);
  auVar44 = vshufpd_avx(auVar56,auVar56,3);
  auVar56 = vminps_avx(auVar56,auVar44);
  auVar44 = vshufpd_avx(auVar53,auVar53,3);
  auVar53 = vmaxps_avx(auVar53,auVar44);
  auVar56 = vandps_avx512vl(auVar56,auVar264._0_16_);
  auVar53 = vandps_avx512vl(auVar53,auVar264._0_16_);
  auVar53 = vmaxps_avx(auVar56,auVar53);
  auVar56 = vmovshdup_avx(auVar53);
  auVar53 = vmaxss_avx(auVar56,auVar53);
  auVar56 = vmovddup_avx512vl(auVar43);
  auVar44 = vmovddup_avx512vl(auVar45);
  auVar184._0_8_ = auVar46._0_8_;
  auVar184._8_8_ = auVar184._0_8_;
  auVar192._0_8_ = auVar47._0_8_;
  auVar192._8_8_ = auVar192._0_8_;
  local_2b0 = ZEXT416((uint)(auVar53._0_4_ * 9.536743e-07));
  local_240 = vbroadcastss_avx512vl(local_2b0);
  auVar53 = vxorps_avx512vl(local_240._0_16_,auVar39);
  local_260 = vbroadcastss_avx512vl(auVar53);
  bVar33 = false;
  uVar26 = 0;
  fVar142 = *(float *)(ray + k * 4 + 0x60);
  local_270 = vsubps_avx(auVar54,auVar62);
  local_280 = vsubps_avx(auVar63,auVar54);
  local_290 = vsubps_avx512vl(_local_2a0,auVar63);
  local_3d0 = vsubps_avx512vl(_local_380,local_340);
  local_3e0 = vsubps_avx512vl(_local_390,local_350);
  local_3f0 = vsubps_avx512vl(_local_3a0,local_360);
  _local_400 = vsubps_avx(_local_3b0,local_370);
  local_1e0 = vpbroadcastd_avx512vl();
  auVar53 = ZEXT816(0x3f80000000000000);
  auVar39 = auVar53;
LAB_019347b3:
  auVar43 = vshufps_avx(auVar39,auVar39,0x50);
  auVar244._8_4_ = 0x3f800000;
  auVar244._0_8_ = 0x3f8000003f800000;
  auVar244._12_4_ = 0x3f800000;
  auVar248._16_4_ = 0x3f800000;
  auVar248._0_16_ = auVar244;
  auVar248._20_4_ = 0x3f800000;
  auVar248._24_4_ = 0x3f800000;
  auVar248._28_4_ = 0x3f800000;
  auVar45 = vsubps_avx(auVar244,auVar43);
  fVar225 = auVar43._0_4_;
  fVar132 = auVar48._0_4_;
  auVar134._0_4_ = fVar132 * fVar225;
  fVar209 = auVar43._4_4_;
  fVar140 = auVar48._4_4_;
  auVar134._4_4_ = fVar140 * fVar209;
  fVar220 = auVar43._8_4_;
  auVar134._8_4_ = fVar132 * fVar220;
  fVar221 = auVar43._12_4_;
  auVar134._12_4_ = fVar140 * fVar221;
  fVar141 = auVar49._0_4_;
  auVar149._0_4_ = fVar141 * fVar225;
  fVar207 = auVar49._4_4_;
  auVar149._4_4_ = fVar207 * fVar209;
  auVar149._8_4_ = fVar141 * fVar220;
  auVar149._12_4_ = fVar207 * fVar221;
  fVar208 = auVar50._0_4_;
  auVar165._0_4_ = fVar208 * fVar225;
  fVar219 = auVar50._4_4_;
  auVar165._4_4_ = fVar219 * fVar209;
  auVar165._8_4_ = fVar208 * fVar220;
  auVar165._12_4_ = fVar219 * fVar221;
  fVar226 = auVar51._0_4_;
  auVar114._0_4_ = fVar226 * fVar225;
  fVar236 = auVar51._4_4_;
  auVar114._4_4_ = fVar236 * fVar209;
  auVar114._8_4_ = fVar226 * fVar220;
  auVar114._12_4_ = fVar236 * fVar221;
  auVar47 = vfmadd231ps_avx512vl(auVar134,auVar45,auVar56);
  auVar52 = vfmadd231ps_avx512vl(auVar149,auVar45,auVar44);
  auVar46 = vfmadd231ps_fma(auVar165,auVar45,auVar184);
  auVar45 = vfmadd231ps_fma(auVar114,auVar192,auVar45);
  auVar43 = vmovshdup_avx(auVar53);
  fVar209 = auVar53._0_4_;
  fVar225 = (auVar43._0_4_ - fVar209) * 0.04761905;
  auVar138._4_4_ = fVar209;
  auVar138._0_4_ = fVar209;
  auVar138._8_4_ = fVar209;
  auVar138._12_4_ = fVar209;
  auVar138._16_4_ = fVar209;
  auVar138._20_4_ = fVar209;
  auVar138._24_4_ = fVar209;
  auVar138._28_4_ = fVar209;
  auVar77._0_8_ = auVar43._0_8_;
  auVar77._8_8_ = auVar77._0_8_;
  auVar77._16_8_ = auVar77._0_8_;
  auVar77._24_8_ = auVar77._0_8_;
  auVar67 = vsubps_avx(auVar77,auVar138);
  uVar100 = auVar47._0_4_;
  auVar87._4_4_ = uVar100;
  auVar87._0_4_ = uVar100;
  auVar87._8_4_ = uVar100;
  auVar87._12_4_ = uVar100;
  auVar87._16_4_ = uVar100;
  auVar87._20_4_ = uVar100;
  auVar87._24_4_ = uVar100;
  auVar87._28_4_ = uVar100;
  auVar78._8_4_ = 1;
  auVar78._0_8_ = 0x100000001;
  auVar78._12_4_ = 1;
  auVar78._16_4_ = 1;
  auVar78._20_4_ = 1;
  auVar78._24_4_ = 1;
  auVar78._28_4_ = 1;
  auVar85 = ZEXT1632(auVar47);
  auVar83 = vpermps_avx2(auVar78,auVar85);
  auVar68 = vbroadcastss_avx512vl(auVar52);
  auVar84 = ZEXT1632(auVar52);
  auVar69 = vpermps_avx512vl(auVar78,auVar84);
  auVar70 = vbroadcastss_avx512vl(auVar46);
  auVar79 = ZEXT1632(auVar46);
  auVar71 = vpermps_avx512vl(auVar78,auVar79);
  auVar72 = vbroadcastss_avx512vl(auVar45);
  auVar82 = ZEXT1632(auVar45);
  auVar73 = vpermps_avx512vl(auVar78,auVar82);
  auVar205._4_4_ = fVar225;
  auVar205._0_4_ = fVar225;
  auVar205._8_4_ = fVar225;
  auVar205._12_4_ = fVar225;
  auVar205._16_4_ = fVar225;
  auVar205._20_4_ = fVar225;
  auVar205._24_4_ = fVar225;
  auVar205._28_4_ = fVar225;
  auVar80._8_4_ = 2;
  auVar80._0_8_ = 0x200000002;
  auVar80._12_4_ = 2;
  auVar80._16_4_ = 2;
  auVar80._20_4_ = 2;
  auVar80._24_4_ = 2;
  auVar80._28_4_ = 2;
  auVar74 = vpermps_avx512vl(auVar80,auVar85);
  auVar75 = vbroadcastss_avx512vl(ZEXT416(3));
  auVar76 = vpermps_avx512vl(auVar75,auVar85);
  auVar77 = vpermps_avx512vl(auVar80,auVar84);
  auVar78 = vpermps_avx512vl(auVar75,auVar84);
  auVar85 = vpermps_avx2(auVar80,auVar79);
  auVar79 = vpermps_avx512vl(auVar75,auVar79);
  auVar80 = vpermps_avx512vl(auVar80,auVar82);
  auVar81 = vpermps_avx512vl(auVar75,auVar82);
  auVar43 = vfmadd132ps_fma(auVar67,auVar138,_DAT_01f7b040);
  auVar67 = vsubps_avx(auVar248,ZEXT1632(auVar43));
  auVar75 = vmulps_avx512vl(auVar68,ZEXT1632(auVar43));
  auVar84 = ZEXT1632(auVar43);
  auVar82 = vmulps_avx512vl(auVar69,auVar84);
  auVar45 = vfmadd231ps_fma(auVar75,auVar67,auVar87);
  auVar46 = vfmadd231ps_fma(auVar82,auVar67,auVar83);
  auVar75 = vmulps_avx512vl(auVar70,auVar84);
  auVar82 = vmulps_avx512vl(auVar71,auVar84);
  auVar68 = vfmadd231ps_avx512vl(auVar75,auVar67,auVar68);
  auVar69 = vfmadd231ps_avx512vl(auVar82,auVar67,auVar69);
  auVar75 = vmulps_avx512vl(auVar72,auVar84);
  auVar87 = ZEXT1632(auVar43);
  auVar73 = vmulps_avx512vl(auVar73,auVar87);
  auVar70 = vfmadd231ps_avx512vl(auVar75,auVar67,auVar70);
  auVar71 = vfmadd231ps_avx512vl(auVar73,auVar67,auVar71);
  fVar220 = auVar43._0_4_;
  fVar221 = auVar43._4_4_;
  auVar73._4_4_ = fVar221 * auVar68._4_4_;
  auVar73._0_4_ = fVar220 * auVar68._0_4_;
  fVar222 = auVar43._8_4_;
  auVar73._8_4_ = fVar222 * auVar68._8_4_;
  fVar223 = auVar43._12_4_;
  auVar73._12_4_ = fVar223 * auVar68._12_4_;
  auVar73._16_4_ = auVar68._16_4_ * 0.0;
  auVar73._20_4_ = auVar68._20_4_ * 0.0;
  auVar73._24_4_ = auVar68._24_4_ * 0.0;
  auVar73._28_4_ = fVar209;
  auVar75._4_4_ = fVar221 * auVar69._4_4_;
  auVar75._0_4_ = fVar220 * auVar69._0_4_;
  auVar75._8_4_ = fVar222 * auVar69._8_4_;
  auVar75._12_4_ = fVar223 * auVar69._12_4_;
  auVar75._16_4_ = auVar69._16_4_ * 0.0;
  auVar75._20_4_ = auVar69._20_4_ * 0.0;
  auVar75._24_4_ = auVar69._24_4_ * 0.0;
  auVar75._28_4_ = auVar83._28_4_;
  auVar45 = vfmadd231ps_fma(auVar73,auVar67,ZEXT1632(auVar45));
  auVar46 = vfmadd231ps_fma(auVar75,auVar67,ZEXT1632(auVar46));
  auVar86._0_4_ = fVar220 * auVar70._0_4_;
  auVar86._4_4_ = fVar221 * auVar70._4_4_;
  auVar86._8_4_ = fVar222 * auVar70._8_4_;
  auVar86._12_4_ = fVar223 * auVar70._12_4_;
  auVar86._16_4_ = auVar70._16_4_ * 0.0;
  auVar86._20_4_ = auVar70._20_4_ * 0.0;
  auVar86._24_4_ = auVar70._24_4_ * 0.0;
  auVar86._28_4_ = 0;
  auVar82._4_4_ = fVar221 * auVar71._4_4_;
  auVar82._0_4_ = fVar220 * auVar71._0_4_;
  auVar82._8_4_ = fVar222 * auVar71._8_4_;
  auVar82._12_4_ = fVar223 * auVar71._12_4_;
  auVar82._16_4_ = auVar71._16_4_ * 0.0;
  auVar82._20_4_ = auVar71._20_4_ * 0.0;
  auVar82._24_4_ = auVar71._24_4_ * 0.0;
  auVar82._28_4_ = auVar70._28_4_;
  auVar47 = vfmadd231ps_fma(auVar86,auVar67,auVar68);
  auVar52 = vfmadd231ps_fma(auVar82,auVar67,auVar69);
  auVar84._28_4_ = auVar69._28_4_;
  auVar84._0_28_ =
       ZEXT1628(CONCAT412(fVar223 * auVar52._12_4_,
                          CONCAT48(fVar222 * auVar52._8_4_,
                                   CONCAT44(fVar221 * auVar52._4_4_,fVar220 * auVar52._0_4_))));
  auVar55 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar223 * auVar47._12_4_,
                                               CONCAT48(fVar222 * auVar47._8_4_,
                                                        CONCAT44(fVar221 * auVar47._4_4_,
                                                                 fVar220 * auVar47._0_4_)))),auVar67
                            ,ZEXT1632(auVar45));
  auVar58 = vfmadd231ps_fma(auVar84,auVar67,ZEXT1632(auVar46));
  auVar83 = vsubps_avx(ZEXT1632(auVar47),ZEXT1632(auVar45));
  auVar68 = vsubps_avx(ZEXT1632(auVar52),ZEXT1632(auVar46));
  auVar69 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
  auVar83 = vmulps_avx512vl(auVar83,auVar69);
  auVar68 = vmulps_avx512vl(auVar68,auVar69);
  auVar156._0_4_ = fVar225 * auVar83._0_4_;
  auVar156._4_4_ = fVar225 * auVar83._4_4_;
  auVar156._8_4_ = fVar225 * auVar83._8_4_;
  auVar156._12_4_ = fVar225 * auVar83._12_4_;
  auVar156._16_4_ = fVar225 * auVar83._16_4_;
  auVar156._20_4_ = fVar225 * auVar83._20_4_;
  auVar156._24_4_ = fVar225 * auVar83._24_4_;
  auVar156._28_4_ = 0;
  auVar83 = vmulps_avx512vl(auVar205,auVar68);
  auVar46 = vxorps_avx512vl(auVar72._0_16_,auVar72._0_16_);
  auVar68 = vpermt2ps_avx512vl(ZEXT1632(auVar55),_DAT_01fb9fc0,ZEXT1632(auVar46));
  auVar70 = vpermt2ps_avx512vl(ZEXT1632(auVar58),_DAT_01fb9fc0,ZEXT1632(auVar46));
  auVar119._0_4_ = auVar156._0_4_ + auVar55._0_4_;
  auVar119._4_4_ = auVar156._4_4_ + auVar55._4_4_;
  auVar119._8_4_ = auVar156._8_4_ + auVar55._8_4_;
  auVar119._12_4_ = auVar156._12_4_ + auVar55._12_4_;
  auVar119._16_4_ = auVar156._16_4_ + 0.0;
  auVar119._20_4_ = auVar156._20_4_ + 0.0;
  auVar119._24_4_ = auVar156._24_4_ + 0.0;
  auVar119._28_4_ = 0;
  auVar86 = ZEXT1632(auVar46);
  auVar71 = vpermt2ps_avx512vl(auVar156,_DAT_01fb9fc0,auVar86);
  auVar72 = vaddps_avx512vl(ZEXT1632(auVar58),auVar83);
  auVar73 = vpermt2ps_avx512vl(auVar83,_DAT_01fb9fc0,auVar86);
  auVar83 = vsubps_avx(auVar68,auVar71);
  auVar71 = vsubps_avx512vl(auVar70,auVar73);
  auVar73 = vmulps_avx512vl(auVar77,auVar87);
  auVar75 = vmulps_avx512vl(auVar78,auVar87);
  auVar73 = vfmadd231ps_avx512vl(auVar73,auVar67,auVar74);
  auVar75 = vfmadd231ps_avx512vl(auVar75,auVar67,auVar76);
  auVar82 = vmulps_avx512vl(auVar85,auVar87);
  auVar84 = vmulps_avx512vl(auVar79,auVar87);
  auVar82 = vfmadd231ps_avx512vl(auVar82,auVar67,auVar77);
  auVar84 = vfmadd231ps_avx512vl(auVar84,auVar67,auVar78);
  auVar74 = vmulps_avx512vl(auVar80,auVar87);
  auVar76 = vmulps_avx512vl(auVar81,auVar87);
  auVar45 = vfmadd231ps_fma(auVar74,auVar67,auVar85);
  auVar85 = vfmadd231ps_avx512vl(auVar76,auVar67,auVar79);
  auVar74 = vmulps_avx512vl(auVar87,auVar82);
  auVar77 = ZEXT1632(auVar43);
  auVar76 = vmulps_avx512vl(auVar77,auVar84);
  auVar73 = vfmadd231ps_avx512vl(auVar74,auVar67,auVar73);
  auVar75 = vfmadd231ps_avx512vl(auVar76,auVar67,auVar75);
  auVar85 = vmulps_avx512vl(auVar77,auVar85);
  auVar82 = vfmadd231ps_avx512vl
                      (ZEXT1632(CONCAT412(fVar223 * auVar45._12_4_,
                                          CONCAT48(fVar222 * auVar45._8_4_,
                                                   CONCAT44(fVar221 * auVar45._4_4_,
                                                            fVar220 * auVar45._0_4_)))),auVar67,
                       auVar82);
  auVar85 = vfmadd231ps_avx512vl(auVar85,auVar67,auVar84);
  auVar74._4_4_ = fVar221 * auVar82._4_4_;
  auVar74._0_4_ = fVar220 * auVar82._0_4_;
  auVar74._8_4_ = fVar222 * auVar82._8_4_;
  auVar74._12_4_ = fVar223 * auVar82._12_4_;
  auVar74._16_4_ = auVar82._16_4_ * 0.0;
  auVar74._20_4_ = auVar82._20_4_ * 0.0;
  auVar74._24_4_ = auVar82._24_4_ * 0.0;
  auVar74._28_4_ = auVar79._28_4_;
  auVar84 = vmulps_avx512vl(auVar77,auVar85);
  auVar74 = vfmadd231ps_avx512vl(auVar74,auVar67,auVar73);
  auVar84 = vfmadd231ps_avx512vl(auVar84,auVar75,auVar67);
  auVar67 = vsubps_avx512vl(auVar82,auVar73);
  auVar85 = vsubps_avx512vl(auVar85,auVar75);
  auVar67 = vmulps_avx512vl(auVar67,auVar69);
  auVar85 = vmulps_avx512vl(auVar85,auVar69);
  fVar209 = fVar225 * auVar67._0_4_;
  fVar220 = fVar225 * auVar67._4_4_;
  auVar76._4_4_ = fVar220;
  auVar76._0_4_ = fVar209;
  fVar221 = fVar225 * auVar67._8_4_;
  auVar76._8_4_ = fVar221;
  fVar222 = fVar225 * auVar67._12_4_;
  auVar76._12_4_ = fVar222;
  fVar223 = fVar225 * auVar67._16_4_;
  auVar76._16_4_ = fVar223;
  fVar224 = fVar225 * auVar67._20_4_;
  auVar76._20_4_ = fVar224;
  fVar225 = fVar225 * auVar67._24_4_;
  auVar76._24_4_ = fVar225;
  auVar76._28_4_ = auVar67._28_4_;
  auVar85 = vmulps_avx512vl(auVar205,auVar85);
  auVar69 = vpermt2ps_avx512vl(auVar74,_DAT_01fb9fc0,auVar86);
  auVar73 = vpermt2ps_avx512vl(auVar84,_DAT_01fb9fc0,auVar86);
  auVar206._0_4_ = auVar74._0_4_ + fVar209;
  auVar206._4_4_ = auVar74._4_4_ + fVar220;
  auVar206._8_4_ = auVar74._8_4_ + fVar221;
  auVar206._12_4_ = auVar74._12_4_ + fVar222;
  auVar206._16_4_ = auVar74._16_4_ + fVar223;
  auVar206._20_4_ = auVar74._20_4_ + fVar224;
  auVar206._24_4_ = auVar74._24_4_ + fVar225;
  auVar206._28_4_ = auVar74._28_4_ + auVar67._28_4_;
  auVar67 = vpermt2ps_avx512vl(auVar76,_DAT_01fb9fc0,ZEXT1632(auVar46));
  auVar75 = vaddps_avx512vl(auVar84,auVar85);
  auVar85 = vpermt2ps_avx512vl(auVar85,_DAT_01fb9fc0,ZEXT1632(auVar46));
  auVar67 = vsubps_avx(auVar69,auVar67);
  auVar85 = vsubps_avx512vl(auVar73,auVar85);
  auVar258 = ZEXT3264(auVar85);
  auVar138 = ZEXT1632(auVar55);
  auVar82 = vsubps_avx512vl(auVar74,auVar138);
  auVar156 = ZEXT1632(auVar58);
  auVar76 = vsubps_avx512vl(auVar84,auVar156);
  auVar77 = vsubps_avx512vl(auVar69,auVar68);
  auVar82 = vaddps_avx512vl(auVar82,auVar77);
  auVar77 = vsubps_avx512vl(auVar73,auVar70);
  auVar76 = vaddps_avx512vl(auVar76,auVar77);
  auVar77 = vmulps_avx512vl(auVar156,auVar82);
  auVar77 = vfnmadd231ps_avx512vl(auVar77,auVar138,auVar76);
  auVar78 = vmulps_avx512vl(auVar72,auVar82);
  auVar78 = vfnmadd231ps_avx512vl(auVar78,auVar119,auVar76);
  auVar79 = vmulps_avx512vl(auVar71,auVar82);
  auVar79 = vfnmadd231ps_avx512vl(auVar79,auVar83,auVar76);
  auVar80 = vmulps_avx512vl(auVar70,auVar82);
  auVar80 = vfnmadd231ps_avx512vl(auVar80,auVar68,auVar76);
  auVar81 = vmulps_avx512vl(auVar84,auVar82);
  auVar81 = vfnmadd231ps_avx512vl(auVar81,auVar74,auVar76);
  auVar86 = vmulps_avx512vl(auVar75,auVar82);
  auVar86 = vfnmadd231ps_avx512vl(auVar86,auVar206,auVar76);
  auVar87 = vmulps_avx512vl(auVar85,auVar82);
  auVar87 = vfnmadd231ps_avx512vl(auVar87,auVar67,auVar76);
  auVar82 = vmulps_avx512vl(auVar73,auVar82);
  auVar82 = vfnmadd231ps_avx512vl(auVar82,auVar69,auVar76);
  auVar76 = vminps_avx512vl(auVar77,auVar78);
  auVar77 = vmaxps_avx512vl(auVar77,auVar78);
  auVar78 = vminps_avx512vl(auVar79,auVar80);
  auVar76 = vminps_avx512vl(auVar76,auVar78);
  auVar78 = vmaxps_avx512vl(auVar79,auVar80);
  auVar77 = vmaxps_avx512vl(auVar77,auVar78);
  auVar78 = vminps_avx512vl(auVar81,auVar86);
  auVar79 = vmaxps_avx512vl(auVar81,auVar86);
  auVar80 = vminps_avx512vl(auVar87,auVar82);
  auVar78 = vminps_avx512vl(auVar78,auVar80);
  auVar76 = vminps_avx512vl(auVar76,auVar78);
  auVar82 = vmaxps_avx512vl(auVar87,auVar82);
  auVar82 = vmaxps_avx512vl(auVar79,auVar82);
  auVar82 = vmaxps_avx512vl(auVar77,auVar82);
  uVar18 = vcmpps_avx512vl(auVar76,local_240,2);
  uVar19 = vcmpps_avx512vl(auVar82,local_260,5);
  bVar24 = (byte)uVar18 & (byte)uVar19 & 0x7f;
  if (bVar24 == 0) {
    auVar53 = vxorps_avx512vl(auVar82._0_16_,auVar82._0_16_);
    auVar259 = ZEXT1664(auVar53);
    auVar53 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
    auVar263 = ZEXT1664(auVar53);
    auVar67 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
    auVar260 = ZEXT3264(auVar67);
    auVar53 = vbroadcastss_avx512vl(ZEXT416(0x3e124925));
    auVar261 = ZEXT1664(auVar53);
    auVar262 = ZEXT3264(_DAT_01fb9fe0);
  }
  else {
    auVar82 = vsubps_avx512vl(auVar68,auVar138);
    auVar76 = vsubps_avx512vl(auVar70,auVar156);
    auVar77 = vsubps_avx512vl(auVar69,auVar74);
    auVar82 = vaddps_avx512vl(auVar82,auVar77);
    auVar77 = vsubps_avx512vl(auVar73,auVar84);
    auVar76 = vaddps_avx512vl(auVar76,auVar77);
    auVar77 = vmulps_avx512vl(auVar156,auVar82);
    auVar77 = vfnmadd231ps_avx512vl(auVar77,auVar76,auVar138);
    auVar72 = vmulps_avx512vl(auVar72,auVar82);
    auVar72 = vfnmadd213ps_avx512vl(auVar119,auVar76,auVar72);
    auVar71 = vmulps_avx512vl(auVar71,auVar82);
    auVar71 = vfnmadd213ps_avx512vl(auVar83,auVar76,auVar71);
    auVar83 = vmulps_avx512vl(auVar70,auVar82);
    auVar70 = vfnmadd231ps_avx512vl(auVar83,auVar76,auVar68);
    auVar83 = vmulps_avx512vl(auVar84,auVar82);
    auVar84 = vfnmadd231ps_avx512vl(auVar83,auVar76,auVar74);
    auVar83 = vmulps_avx512vl(auVar75,auVar82);
    auVar75 = vfnmadd213ps_avx512vl(auVar206,auVar76,auVar83);
    auVar83 = vmulps_avx512vl(auVar85,auVar82);
    auVar74 = vfnmadd213ps_avx512vl(auVar67,auVar76,auVar83);
    auVar67 = vmulps_avx512vl(auVar73,auVar82);
    auVar73 = vfnmadd231ps_avx512vl(auVar67,auVar69,auVar76);
    auVar83 = vminps_avx(auVar77,auVar72);
    auVar67 = vmaxps_avx(auVar77,auVar72);
    auVar68 = vminps_avx(auVar71,auVar70);
    auVar68 = vminps_avx(auVar83,auVar68);
    auVar83 = vmaxps_avx(auVar71,auVar70);
    auVar67 = vmaxps_avx(auVar67,auVar83);
    auVar85 = vminps_avx(auVar84,auVar75);
    auVar83 = vmaxps_avx(auVar84,auVar75);
    auVar69 = vminps_avx(auVar74,auVar73);
    auVar85 = vminps_avx(auVar85,auVar69);
    auVar85 = vminps_avx(auVar68,auVar85);
    auVar68 = vmaxps_avx(auVar74,auVar73);
    auVar83 = vmaxps_avx(auVar83,auVar68);
    auVar67 = vmaxps_avx(auVar67,auVar83);
    uVar18 = vcmpps_avx512vl(auVar67,local_260,5);
    uVar19 = vcmpps_avx512vl(auVar85,local_240,2);
    bVar24 = bVar24 & (byte)uVar18 & (byte)uVar19;
    if (bVar24 != 0) {
      auStack_460[uVar26] = (uint)bVar24;
      uVar18 = vmovlps_avx(auVar53);
      (&uStack_220)[uVar26] = uVar18;
      uVar1 = vmovlps_avx(auVar39);
      auStack_1a0[uVar26] = uVar1;
      uVar26 = (ulong)((int)uVar26 + 1);
    }
    auVar53 = vxorps_avx512vl(auVar82._0_16_,auVar82._0_16_);
    auVar259 = ZEXT1664(auVar53);
    auVar53 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
    auVar263 = ZEXT1664(auVar53);
    auVar67 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
    auVar260 = ZEXT3264(auVar67);
    auVar53 = vbroadcastss_avx512vl(ZEXT416(0x3e124925));
    auVar261 = ZEXT1664(auVar53);
    auVar262 = ZEXT3264(_DAT_01fb9fe0);
  }
LAB_01934d13:
  do {
    do {
      do {
        in_ZMM28 = ZEXT464(0xff800000);
        auVar46 = in_ZMM28._0_16_;
        auVar43 = auVar259._0_16_;
        auVar45 = auVar263._0_16_;
        if ((int)uVar26 == 0) {
          if (bVar33) goto LAB_01935c27;
          uVar100 = *(undefined4 *)(ray + k * 4 + 0x100);
          auVar23._4_4_ = uVar100;
          auVar23._0_4_ = uVar100;
          auVar23._8_4_ = uVar100;
          auVar23._12_4_ = uVar100;
          uVar18 = vcmpps_avx512vl(local_3c0,auVar23,2);
          uVar32 = (ulong)((uint)uVar32 & (uint)uVar32 + 0xf & (uint)uVar18);
          goto LAB_01933c37;
        }
        uVar25 = (int)uVar26 - 1;
        uVar27 = (ulong)uVar25;
        uVar5 = auStack_460[uVar27];
        auVar39._8_8_ = 0;
        auVar39._0_8_ = auStack_1a0[uVar27];
        uVar1 = 0;
        for (uVar30 = (ulong)uVar5; (uVar30 & 1) == 0; uVar30 = uVar30 >> 1 | 0x8000000000000000) {
          uVar1 = uVar1 + 1;
        }
        uVar28 = uVar5 - 1 & uVar5;
        bVar36 = uVar28 == 0;
        auStack_460[uVar27] = uVar28;
        if (bVar36) {
          uVar26 = (ulong)uVar25;
        }
        auVar102._8_8_ = 0;
        auVar102._0_8_ = uVar1;
        auVar53 = vpunpcklqdq_avx(auVar102,ZEXT416((int)uVar1 + 1));
        auVar53 = vcvtqq2ps_avx512vl(auVar53);
        auVar53 = vmulps_avx512vl(auVar53,auVar261._0_16_);
        uVar100 = *(undefined4 *)((long)&uStack_220 + uVar27 * 8 + 4);
        auVar20._4_4_ = uVar100;
        auVar20._0_4_ = uVar100;
        auVar20._8_4_ = uVar100;
        auVar20._12_4_ = uVar100;
        auVar47 = vmulps_avx512vl(auVar53,auVar20);
        auVar127._8_4_ = 0x3f800000;
        auVar127._0_8_ = 0x3f8000003f800000;
        auVar127._12_4_ = 0x3f800000;
        auVar53 = vsubps_avx(auVar127,auVar53);
        uVar100 = *(undefined4 *)(&uStack_220 + uVar27);
        auVar21._4_4_ = uVar100;
        auVar21._0_4_ = uVar100;
        auVar21._8_4_ = uVar100;
        auVar21._12_4_ = uVar100;
        auVar53 = vfmadd231ps_avx512vl(auVar47,auVar53,auVar21);
        auVar47 = vmovshdup_avx(auVar53);
        fVar225 = auVar47._0_4_ - auVar53._0_4_;
        vucomiss_avx512f(ZEXT416((uint)fVar225));
        if (uVar5 == 0 || bVar36) goto LAB_019347b3;
        auVar47 = vshufps_avx(auVar39,auVar39,0x50);
        vucomiss_avx512f(ZEXT416((uint)fVar225));
        auVar135._8_4_ = 0x3f800000;
        auVar135._0_8_ = 0x3f8000003f800000;
        auVar135._12_4_ = 0x3f800000;
        auVar52 = vsubps_avx(auVar135,auVar47);
        fVar209 = auVar47._0_4_;
        auVar150._0_4_ = fVar209 * fVar132;
        fVar220 = auVar47._4_4_;
        auVar150._4_4_ = fVar220 * fVar140;
        fVar221 = auVar47._8_4_;
        auVar150._8_4_ = fVar221 * fVar132;
        fVar222 = auVar47._12_4_;
        auVar150._12_4_ = fVar222 * fVar140;
        auVar166._0_4_ = fVar209 * fVar141;
        auVar166._4_4_ = fVar220 * fVar207;
        auVar166._8_4_ = fVar221 * fVar141;
        auVar166._12_4_ = fVar222 * fVar207;
        auVar172._0_4_ = fVar209 * fVar208;
        auVar172._4_4_ = fVar220 * fVar219;
        auVar172._8_4_ = fVar221 * fVar208;
        auVar172._12_4_ = fVar222 * fVar219;
        auVar128._0_4_ = fVar209 * fVar226;
        auVar128._4_4_ = fVar220 * fVar236;
        auVar128._8_4_ = fVar221 * fVar226;
        auVar128._12_4_ = fVar222 * fVar236;
        auVar47 = vfmadd231ps_fma(auVar150,auVar52,auVar56);
        auVar55 = vfmadd231ps_fma(auVar166,auVar52,auVar44);
        auVar58 = vfmadd231ps_fma(auVar172,auVar52,auVar184);
        auVar52 = vfmadd231ps_fma(auVar128,auVar52,auVar192);
        auVar81._16_16_ = auVar47;
        auVar81._0_16_ = auVar47;
        auVar157._16_16_ = auVar55;
        auVar157._0_16_ = auVar55;
        auVar170._16_16_ = auVar58;
        auVar170._0_16_ = auVar58;
        auVar83 = vpermps_avx512vl(auVar262._0_32_,ZEXT1632(auVar53));
        auVar67 = vsubps_avx(auVar157,auVar81);
        auVar55 = vfmadd213ps_fma(auVar67,auVar83,auVar81);
        auVar67 = vsubps_avx(auVar170,auVar157);
        auVar59 = vfmadd213ps_fma(auVar67,auVar83,auVar157);
        auVar47 = vsubps_avx(auVar52,auVar58);
        auVar158._16_16_ = auVar47;
        auVar158._0_16_ = auVar47;
        auVar47 = vfmadd213ps_fma(auVar158,auVar83,auVar170);
        auVar67 = vsubps_avx(ZEXT1632(auVar59),ZEXT1632(auVar55));
        auVar52 = vfmadd213ps_fma(auVar67,auVar83,ZEXT1632(auVar55));
        auVar67 = vsubps_avx(ZEXT1632(auVar47),ZEXT1632(auVar59));
        auVar47 = vfmadd213ps_fma(auVar67,auVar83,ZEXT1632(auVar59));
        auVar67 = vsubps_avx(ZEXT1632(auVar47),ZEXT1632(auVar52));
        auVar57 = vfmadd231ps_fma(ZEXT1632(auVar52),auVar67,auVar83);
        auVar67 = vmulps_avx512vl(auVar67,auVar260._0_32_);
        auVar79._16_16_ = auVar67._16_16_;
        auVar47 = vmulss_avx512f(ZEXT416((uint)fVar225),SUB6416(ZEXT464(0x3eaaaaab),0));
        fVar209 = auVar47._0_4_;
        auVar173._0_8_ =
             CONCAT44(auVar57._4_4_ + fVar209 * auVar67._4_4_,
                      auVar57._0_4_ + fVar209 * auVar67._0_4_);
        auVar173._8_4_ = auVar57._8_4_ + fVar209 * auVar67._8_4_;
        auVar173._12_4_ = auVar57._12_4_ + fVar209 * auVar67._12_4_;
        auVar151._0_4_ = fVar209 * auVar67._16_4_;
        auVar151._4_4_ = fVar209 * auVar67._20_4_;
        auVar151._8_4_ = fVar209 * auVar67._24_4_;
        auVar151._12_4_ = fVar209 * auVar67._28_4_;
        auVar40 = vsubps_avx((undefined1  [16])0x0,auVar151);
        auVar59 = vshufpd_avx(auVar57,auVar57,3);
        auVar60 = vshufpd_avx((undefined1  [16])0x0,(undefined1  [16])0x0,3);
        auVar47 = vsubps_avx(auVar59,auVar57);
        auVar52 = vsubps_avx(auVar60,(undefined1  [16])0x0);
        auVar193._0_4_ = auVar47._0_4_ + auVar52._0_4_;
        auVar193._4_4_ = auVar47._4_4_ + auVar52._4_4_;
        auVar193._8_4_ = auVar47._8_4_ + auVar52._8_4_;
        auVar193._12_4_ = auVar47._12_4_ + auVar52._12_4_;
        auVar47 = vshufps_avx(auVar57,auVar57,0xb1);
        auVar52 = vshufps_avx(auVar173,auVar173,0xb1);
        auVar55 = vshufps_avx(auVar40,auVar40,0xb1);
        auVar58 = vshufps_avx((undefined1  [16])0x0,(undefined1  [16])0x0,0xb1);
        auVar245._4_4_ = auVar193._0_4_;
        auVar245._0_4_ = auVar193._0_4_;
        auVar245._8_4_ = auVar193._0_4_;
        auVar245._12_4_ = auVar193._0_4_;
        auVar61 = vshufps_avx(auVar193,auVar193,0x55);
        fVar209 = auVar61._0_4_;
        auVar203._0_4_ = auVar47._0_4_ * fVar209;
        fVar220 = auVar61._4_4_;
        auVar203._4_4_ = auVar47._4_4_ * fVar220;
        fVar221 = auVar61._8_4_;
        auVar203._8_4_ = auVar47._8_4_ * fVar221;
        fVar222 = auVar61._12_4_;
        auVar203._12_4_ = auVar47._12_4_ * fVar222;
        auVar211._0_4_ = auVar52._0_4_ * fVar209;
        auVar211._4_4_ = auVar52._4_4_ * fVar220;
        auVar211._8_4_ = auVar52._8_4_ * fVar221;
        auVar211._12_4_ = auVar52._12_4_ * fVar222;
        auVar230._0_4_ = auVar55._0_4_ * fVar209;
        auVar230._4_4_ = auVar55._4_4_ * fVar220;
        auVar230._8_4_ = auVar55._8_4_ * fVar221;
        auVar230._12_4_ = auVar55._12_4_ * fVar222;
        auVar194._0_4_ = auVar58._0_4_ * fVar209;
        auVar194._4_4_ = auVar58._4_4_ * fVar220;
        auVar194._8_4_ = auVar58._8_4_ * fVar221;
        auVar194._12_4_ = auVar58._12_4_ * fVar222;
        auVar47 = vfmadd231ps_fma(auVar203,auVar245,auVar57);
        auVar52 = vfmadd231ps_fma(auVar211,auVar245,auVar173);
        auVar41 = vfmadd231ps_fma(auVar230,auVar245,auVar40);
        auVar42 = vfmadd231ps_fma(auVar194,(undefined1  [16])0x0,auVar245);
        auVar61 = vshufpd_avx(auVar47,auVar47,1);
        auVar38 = vshufpd_avx(auVar52,auVar52,1);
        auVar64 = vshufpd_avx512vl(auVar41,auVar41,1);
        auVar65 = vshufpd_avx512vl(auVar42,auVar42,1);
        auVar258 = ZEXT1664(auVar65);
        auVar55 = vminss_avx(auVar47,auVar52);
        auVar47 = vmaxss_avx(auVar52,auVar47);
        auVar58 = vminss_avx(auVar41,auVar42);
        auVar52 = vmaxss_avx(auVar42,auVar41);
        auVar55 = vminss_avx(auVar55,auVar58);
        auVar47 = vmaxss_avx(auVar52,auVar47);
        auVar58 = vminss_avx(auVar61,auVar38);
        auVar52 = vmaxss_avx(auVar38,auVar61);
        auVar61 = vminss_avx512f(auVar64,auVar65);
        auVar38 = vmaxss_avx512f(auVar65,auVar64);
        auVar52 = vmaxss_avx(auVar38,auVar52);
        auVar58 = vminss_avx512f(auVar58,auVar61);
        vucomiss_avx512f(auVar55);
        fVar220 = auVar52._0_4_;
        fVar209 = auVar47._0_4_;
        if (4 < (uint)uVar26) {
          bVar37 = fVar220 == -0.0001;
          bVar34 = NAN(fVar220);
          if (fVar220 <= -0.0001) goto LAB_01934f49;
          break;
        }
LAB_01934f49:
        auVar61 = vucomiss_avx512f(auVar58);
        bVar37 = fVar220 <= -0.0001;
        bVar35 = -0.0001 < fVar209;
        bVar34 = bVar37;
        if (!bVar37) break;
        uVar18 = vcmpps_avx512vl(auVar55,auVar61,5);
        uVar19 = vcmpps_avx512vl(auVar58,auVar61,5);
        bVar24 = (byte)uVar18 & (byte)uVar19 & 1;
        bVar37 = bVar35 && bVar24 == 0;
        bVar34 = bVar35 && bVar24 == 0;
      } while (!bVar35 || bVar24 != 0);
      vcmpss_avx512f(auVar55,auVar43,1);
      auVar41 = auVar265._0_16_;
      uVar18 = vcmpss_avx512f(auVar47,auVar43,1);
      bVar35 = (bool)((byte)uVar18 & 1);
      auVar79._0_16_ = auVar41;
      iVar99 = auVar265._0_4_;
      auVar88._4_28_ = auVar79._4_28_;
      auVar88._0_4_ = (float)((uint)bVar35 * -0x40800000 + (uint)!bVar35 * iVar99);
      vucomiss_avx512f(auVar88._0_16_);
      bVar34 = (bool)(!bVar37 | bVar34);
      bVar35 = bVar34 == false;
      auVar90._16_16_ = auVar79._16_16_;
      auVar90._0_16_ = SUB6416(ZEXT464(0x7f800000),0);
      auVar89._4_28_ = auVar90._4_28_;
      auVar89._0_4_ = (uint)bVar34 * auVar259._0_4_ + (uint)!bVar34 * 0x7f800000;
      auVar38 = auVar89._0_16_;
      auVar92._16_16_ = auVar79._16_16_;
      auVar92._0_16_ = auVar46;
      auVar91._4_28_ = auVar92._4_28_;
      auVar91._0_4_ = (uint)bVar34 * auVar259._0_4_ + (uint)!bVar34 * -0x800000;
      auVar61 = auVar91._0_16_;
      uVar18 = vcmpss_avx512f(auVar58,auVar43,1);
      bVar37 = (bool)((byte)uVar18 & 1);
      auVar94._16_16_ = auVar79._16_16_;
      auVar94._0_16_ = auVar41;
      auVar93._4_28_ = auVar94._4_28_;
      auVar93._0_4_ = (float)((uint)bVar37 * -0x40800000 + (uint)!bVar37 * iVar99);
      auVar58 = vucomiss_avx512f(auVar93._0_16_);
      auVar258 = ZEXT1664(auVar58);
      if ((bVar34) || (bVar35)) {
        auVar58 = vucomiss_avx512f(auVar55);
        if ((bVar34) || (bVar35)) {
          auVar42 = vxorps_avx512vl(auVar55,auVar266._0_16_);
          auVar258 = ZEXT1664(auVar42);
          auVar55 = vsubss_avx512f(auVar58,auVar55);
          auVar55 = vdivss_avx512f(auVar42,auVar55);
          auVar58 = vsubss_avx512f(auVar41,auVar55);
          auVar55 = vfmadd213ss_avx512f(auVar58,auVar43,auVar55);
          auVar58 = auVar55;
        }
        else {
          auVar58 = vxorps_avx512vl(auVar58,auVar58);
          vucomiss_avx512f(auVar58);
          if ((bVar34) || (auVar55 = auVar41, bVar35)) {
            auVar55 = auVar46;
            auVar58 = ZEXT416(0x7f800000);
          }
        }
        auVar38 = vminss_avx512f(auVar38,auVar58);
        auVar61 = vmaxss_avx(auVar55,auVar61);
      }
      uVar18 = vcmpss_avx512f(auVar52,auVar43,1);
      bVar37 = (bool)((byte)uVar18 & 1);
      fVar221 = (float)((uint)bVar37 * -0x40800000 + (uint)!bVar37 * iVar99);
      if ((auVar88._0_4_ != fVar221) || (NAN(auVar88._0_4_) || NAN(fVar221))) {
        if ((fVar220 != fVar209) || (NAN(fVar220) || NAN(fVar209))) {
          auVar46 = vxorps_avx512vl(auVar47,auVar266._0_16_);
          auVar195._0_4_ = auVar46._0_4_ / (fVar220 - fVar209);
          auVar195._4_12_ = auVar46._4_12_;
          auVar46 = vsubss_avx512f(auVar41,auVar195);
          auVar47 = vfmadd213ss_avx512f(auVar46,auVar43,auVar195);
          auVar52 = auVar47;
        }
        else if ((fVar209 != 0.0) ||
                (auVar47 = auVar41, auVar52 = SUB6416(ZEXT864(0),0) << 0x20, NAN(fVar209))) {
          auVar47 = auVar46;
          auVar52 = SUB6416(ZEXT464(0x7f800000),0);
        }
        auVar38 = vminss_avx(auVar38,auVar52);
        auVar61 = vmaxss_avx(auVar47,auVar61);
      }
      bVar37 = auVar93._0_4_ != fVar221;
      auVar46 = vminss_avx512f(auVar38,auVar41);
      auVar96._16_16_ = auVar79._16_16_;
      auVar96._0_16_ = auVar38;
      auVar95._4_28_ = auVar96._4_28_;
      auVar95._0_4_ = (uint)bVar37 * auVar46._0_4_ + (uint)!bVar37 * auVar38._0_4_;
      auVar46 = vmaxss_avx512f(auVar41,auVar61);
      auVar98._16_16_ = auVar79._16_16_;
      auVar98._0_16_ = auVar61;
      auVar97._4_28_ = auVar98._4_28_;
      auVar97._0_4_ = (uint)bVar37 * auVar46._0_4_ + (uint)!bVar37 * auVar61._0_4_;
      auVar46 = vmaxss_avx512f(auVar43,auVar95._0_16_);
      auVar47 = vminss_avx512f(auVar97._0_16_,auVar41);
    } while (auVar47._0_4_ < auVar46._0_4_);
    auVar38 = vmaxss_avx512f(auVar43,ZEXT416((uint)(auVar46._0_4_ + -0.1)));
    auVar64 = vminss_avx512f(ZEXT416((uint)(auVar47._0_4_ + 0.1)),auVar41);
    auVar129._0_8_ = auVar57._0_8_;
    auVar129._8_8_ = auVar129._0_8_;
    auVar212._8_8_ = auVar173._0_8_;
    auVar212._0_8_ = auVar173._0_8_;
    auVar231._8_8_ = auVar40._0_8_;
    auVar231._0_8_ = auVar40._0_8_;
    auVar46 = vshufpd_avx(auVar173,auVar173,3);
    auVar47 = vshufpd_avx(auVar40,auVar40,3);
    auVar52 = vshufps_avx(auVar38,auVar64,0);
    auVar246._8_4_ = 0x3f800000;
    auVar246._0_8_ = 0x3f8000003f800000;
    auVar246._12_4_ = 0x3f800000;
    auVar55 = vsubps_avx(auVar246,auVar52);
    fVar209 = auVar52._0_4_;
    auVar167._0_4_ = fVar209 * auVar59._0_4_;
    fVar220 = auVar52._4_4_;
    auVar167._4_4_ = fVar220 * auVar59._4_4_;
    fVar221 = auVar52._8_4_;
    auVar167._8_4_ = fVar221 * auVar59._8_4_;
    fVar222 = auVar52._12_4_;
    auVar167._12_4_ = fVar222 * auVar59._12_4_;
    auVar174._0_4_ = fVar209 * auVar46._0_4_;
    auVar174._4_4_ = fVar220 * auVar46._4_4_;
    auVar174._8_4_ = fVar221 * auVar46._8_4_;
    auVar174._12_4_ = fVar222 * auVar46._12_4_;
    auVar253._0_4_ = auVar47._0_4_ * fVar209;
    auVar253._4_4_ = auVar47._4_4_ * fVar220;
    auVar253._8_4_ = auVar47._8_4_ * fVar221;
    auVar253._12_4_ = auVar47._12_4_ * fVar222;
    auVar152._0_4_ = fVar209 * auVar60._0_4_;
    auVar152._4_4_ = fVar220 * auVar60._4_4_;
    auVar152._8_4_ = fVar221 * auVar60._8_4_;
    auVar152._12_4_ = fVar222 * auVar60._12_4_;
    auVar58 = vfmadd231ps_fma(auVar167,auVar55,auVar129);
    auVar59 = vfmadd231ps_fma(auVar174,auVar55,auVar212);
    auVar60 = vfmadd231ps_fma(auVar253,auVar55,auVar231);
    auVar61 = vfmadd231ps_fma(auVar152,auVar55,ZEXT816(0));
    auVar47 = vsubss_avx512f(auVar41,auVar38);
    auVar46 = vmovshdup_avx(auVar39);
    auVar42 = vfmadd231ss_fma(ZEXT416((uint)(auVar46._0_4_ * auVar38._0_4_)),auVar39,auVar47);
    auVar47 = vsubss_avx512f(auVar41,auVar64);
    auVar57 = vfmadd231ss_fma(ZEXT416((uint)(auVar46._0_4_ * auVar64._0_4_)),auVar39,auVar47);
    auVar38 = vdivss_avx512f(auVar41,ZEXT416((uint)fVar225));
    auVar46 = vsubps_avx(auVar59,auVar58);
    auVar52 = vmulps_avx512vl(auVar46,auVar45);
    auVar46 = vsubps_avx(auVar60,auVar59);
    auVar55 = vmulps_avx512vl(auVar46,auVar45);
    auVar46 = vsubps_avx(auVar61,auVar60);
    auVar46 = vmulps_avx512vl(auVar46,auVar45);
    auVar47 = vminps_avx(auVar55,auVar46);
    auVar46 = vmaxps_avx(auVar55,auVar46);
    auVar47 = vminps_avx(auVar52,auVar47);
    auVar46 = vmaxps_avx(auVar52,auVar46);
    auVar52 = vshufpd_avx(auVar47,auVar47,3);
    auVar55 = vshufpd_avx(auVar46,auVar46,3);
    auVar47 = vminps_avx(auVar47,auVar52);
    auVar46 = vmaxps_avx(auVar46,auVar55);
    fVar225 = auVar38._0_4_;
    auVar196._0_4_ = auVar47._0_4_ * fVar225;
    auVar196._4_4_ = auVar47._4_4_ * fVar225;
    auVar196._8_4_ = auVar47._8_4_ * fVar225;
    auVar196._12_4_ = auVar47._12_4_ * fVar225;
    auVar185._0_4_ = fVar225 * auVar46._0_4_;
    auVar185._4_4_ = fVar225 * auVar46._4_4_;
    auVar185._8_4_ = fVar225 * auVar46._8_4_;
    auVar185._12_4_ = fVar225 * auVar46._12_4_;
    auVar38 = vdivss_avx512f(auVar41,ZEXT416((uint)(auVar57._0_4_ - auVar42._0_4_)));
    auVar46 = vshufpd_avx(auVar58,auVar58,3);
    auVar47 = vshufpd_avx(auVar59,auVar59,3);
    auVar52 = vshufpd_avx(auVar60,auVar60,3);
    auVar55 = vshufpd_avx(auVar61,auVar61,3);
    auVar46 = vsubps_avx(auVar46,auVar58);
    auVar58 = vsubps_avx(auVar47,auVar59);
    auVar59 = vsubps_avx(auVar52,auVar60);
    auVar55 = vsubps_avx(auVar55,auVar61);
    auVar47 = vminps_avx(auVar46,auVar58);
    auVar46 = vmaxps_avx(auVar46,auVar58);
    auVar52 = vminps_avx(auVar59,auVar55);
    auVar52 = vminps_avx(auVar47,auVar52);
    auVar47 = vmaxps_avx(auVar59,auVar55);
    auVar46 = vmaxps_avx(auVar46,auVar47);
    fVar225 = auVar38._0_4_;
    auVar232._0_4_ = fVar225 * auVar52._0_4_;
    auVar232._4_4_ = fVar225 * auVar52._4_4_;
    auVar232._8_4_ = fVar225 * auVar52._8_4_;
    auVar232._12_4_ = fVar225 * auVar52._12_4_;
    auVar213._0_4_ = fVar225 * auVar46._0_4_;
    auVar213._4_4_ = fVar225 * auVar46._4_4_;
    auVar213._8_4_ = fVar225 * auVar46._8_4_;
    auVar213._12_4_ = fVar225 * auVar46._12_4_;
    auVar55 = vinsertps_avx(auVar53,auVar42,0x10);
    auVar64 = vpermt2ps_avx512vl(auVar53,_DAT_01fb9f90,auVar57);
    auVar112._0_4_ = auVar55._0_4_ + auVar64._0_4_;
    auVar112._4_4_ = auVar55._4_4_ + auVar64._4_4_;
    auVar112._8_4_ = auVar55._8_4_ + auVar64._8_4_;
    auVar112._12_4_ = auVar55._12_4_ + auVar64._12_4_;
    auVar22._8_4_ = 0x3f000000;
    auVar22._0_8_ = 0x3f0000003f000000;
    auVar22._12_4_ = 0x3f000000;
    auVar38 = vmulps_avx512vl(auVar112,auVar22);
    auVar47 = vshufps_avx(auVar38,auVar38,0x54);
    uVar100 = auVar38._0_4_;
    auVar115._4_4_ = uVar100;
    auVar115._0_4_ = uVar100;
    auVar115._8_4_ = uVar100;
    auVar115._12_4_ = uVar100;
    auVar52 = vfmadd213ps_fma(local_270,auVar115,auVar62);
    auVar58 = vfmadd213ps_fma(local_280,auVar115,auVar54);
    auVar59 = vfmadd213ps_fma(local_290,auVar115,auVar63);
    auVar46 = vsubps_avx(auVar58,auVar52);
    auVar52 = vfmadd213ps_fma(auVar46,auVar115,auVar52);
    auVar46 = vsubps_avx(auVar59,auVar58);
    auVar46 = vfmadd213ps_fma(auVar46,auVar115,auVar58);
    auVar46 = vsubps_avx(auVar46,auVar52);
    auVar52 = vfmadd231ps_fma(auVar52,auVar46,auVar115);
    auVar60 = vmulps_avx512vl(auVar46,auVar45);
    auVar239._8_8_ = auVar52._0_8_;
    auVar239._0_8_ = auVar52._0_8_;
    auVar46 = vshufpd_avx(auVar52,auVar52,3);
    auVar52 = vshufps_avx(auVar38,auVar38,0x55);
    auVar58 = vsubps_avx(auVar46,auVar239);
    auVar59 = vfmadd231ps_fma(auVar239,auVar52,auVar58);
    auVar254._8_8_ = auVar60._0_8_;
    auVar254._0_8_ = auVar60._0_8_;
    auVar46 = vshufpd_avx(auVar60,auVar60,3);
    auVar46 = vsubps_avx512vl(auVar46,auVar254);
    auVar46 = vfmadd213ps_avx512vl(auVar46,auVar52,auVar254);
    auVar116._0_8_ = auVar58._0_8_ ^ 0x8000000080000000;
    auVar116._8_4_ = auVar58._8_4_ ^ 0x80000000;
    auVar116._12_4_ = auVar58._12_4_ ^ 0x80000000;
    auVar52 = vmovshdup_avx512vl(auVar46);
    auVar255._0_8_ = auVar52._0_8_ ^ 0x8000000080000000;
    auVar255._8_4_ = auVar52._8_4_ ^ 0x80000000;
    auVar255._12_4_ = auVar52._12_4_ ^ 0x80000000;
    auVar60 = vmovshdup_avx512vl(auVar58);
    auVar61 = vpermt2ps_avx512vl(auVar255,ZEXT416(5),auVar58);
    auVar52 = vfmsub231ss_avx512f(ZEXT416((uint)(auVar52._0_4_ * auVar58._0_4_)),auVar46,auVar60);
    auVar58 = vpermt2ps_avx512vl(auVar46,SUB6416(ZEXT464(4),0),auVar116);
    auVar153._0_4_ = auVar52._0_4_;
    auVar153._4_4_ = auVar153._0_4_;
    auVar153._8_4_ = auVar153._0_4_;
    auVar153._12_4_ = auVar153._0_4_;
    auVar46 = vdivps_avx(auVar61,auVar153);
    auVar65 = vdivps_avx512vl(auVar58,auVar153);
    fVar225 = auVar59._0_4_;
    auVar52 = vshufps_avx(auVar59,auVar59,0x55);
    auVar240._0_4_ = fVar225 * auVar46._0_4_ + auVar52._0_4_ * auVar65._0_4_;
    auVar240._4_4_ = fVar225 * auVar46._4_4_ + auVar52._4_4_ * auVar65._4_4_;
    auVar240._8_4_ = fVar225 * auVar46._8_4_ + auVar52._8_4_ * auVar65._8_4_;
    auVar240._12_4_ = fVar225 * auVar46._12_4_ + auVar52._12_4_ * auVar65._12_4_;
    auVar39 = vsubps_avx(auVar47,auVar240);
    auVar52 = vmovshdup_avx(auVar46);
    auVar47 = vinsertps_avx(auVar196,auVar232,0x1c);
    auVar256._0_4_ = auVar52._0_4_ * auVar47._0_4_;
    auVar256._4_4_ = auVar52._4_4_ * auVar47._4_4_;
    auVar256._8_4_ = auVar52._8_4_ * auVar47._8_4_;
    auVar256._12_4_ = auVar52._12_4_ * auVar47._12_4_;
    auVar40 = vinsertps_avx512f(auVar185,auVar213,0x1c);
    auVar52 = vmulps_avx512vl(auVar52,auVar40);
    auVar61 = vminps_avx512vl(auVar256,auVar52);
    auVar59 = vmaxps_avx(auVar52,auVar256);
    auVar60 = vmovshdup_avx(auVar65);
    auVar52 = vinsertps_avx(auVar232,auVar196,0x4c);
    auVar233._0_4_ = auVar60._0_4_ * auVar52._0_4_;
    auVar233._4_4_ = auVar60._4_4_ * auVar52._4_4_;
    auVar233._8_4_ = auVar60._8_4_ * auVar52._8_4_;
    auVar233._12_4_ = auVar60._12_4_ * auVar52._12_4_;
    auVar58 = vinsertps_avx(auVar213,auVar185,0x4c);
    auVar214._0_4_ = auVar60._0_4_ * auVar58._0_4_;
    auVar214._4_4_ = auVar60._4_4_ * auVar58._4_4_;
    auVar214._8_4_ = auVar60._8_4_ * auVar58._8_4_;
    auVar214._12_4_ = auVar60._12_4_ * auVar58._12_4_;
    auVar60 = vminps_avx(auVar233,auVar214);
    auVar61 = vaddps_avx512vl(auVar61,auVar60);
    auVar60 = vmaxps_avx(auVar214,auVar233);
    auVar215._0_4_ = auVar59._0_4_ + auVar60._0_4_;
    auVar215._4_4_ = auVar59._4_4_ + auVar60._4_4_;
    auVar215._8_4_ = auVar59._8_4_ + auVar60._8_4_;
    auVar215._12_4_ = auVar59._12_4_ + auVar60._12_4_;
    auVar234._8_8_ = 0x3f80000000000000;
    auVar234._0_8_ = 0x3f80000000000000;
    auVar59 = vsubps_avx(auVar234,auVar215);
    auVar60 = vsubps_avx(auVar234,auVar61);
    auVar61 = vsubps_avx(auVar55,auVar38);
    auVar38 = vsubps_avx(auVar64,auVar38);
    fVar222 = auVar61._0_4_;
    auVar257._0_4_ = fVar222 * auVar59._0_4_;
    fVar223 = auVar61._4_4_;
    auVar257._4_4_ = fVar223 * auVar59._4_4_;
    fVar224 = auVar61._8_4_;
    auVar257._8_4_ = fVar224 * auVar59._8_4_;
    fVar178 = auVar61._12_4_;
    auVar257._12_4_ = fVar178 * auVar59._12_4_;
    auVar66 = vbroadcastss_avx512vl(auVar46);
    auVar47 = vmulps_avx512vl(auVar66,auVar47);
    auVar40 = vmulps_avx512vl(auVar66,auVar40);
    auVar66 = vminps_avx512vl(auVar47,auVar40);
    auVar40 = vmaxps_avx512vl(auVar40,auVar47);
    auVar47 = vbroadcastss_avx512vl(auVar65);
    auVar52 = vmulps_avx512vl(auVar47,auVar52);
    auVar47 = vmulps_avx512vl(auVar47,auVar58);
    auVar58 = vminps_avx512vl(auVar52,auVar47);
    auVar58 = vaddps_avx512vl(auVar66,auVar58);
    auVar61 = vmulps_avx512vl(auVar61,auVar60);
    auVar258 = ZEXT1664(auVar61);
    fVar225 = auVar38._0_4_;
    auVar216._0_4_ = fVar225 * auVar59._0_4_;
    fVar209 = auVar38._4_4_;
    auVar216._4_4_ = fVar209 * auVar59._4_4_;
    fVar220 = auVar38._8_4_;
    auVar216._8_4_ = fVar220 * auVar59._8_4_;
    fVar221 = auVar38._12_4_;
    auVar216._12_4_ = fVar221 * auVar59._12_4_;
    auVar235._0_4_ = fVar225 * auVar60._0_4_;
    auVar235._4_4_ = fVar209 * auVar60._4_4_;
    auVar235._8_4_ = fVar220 * auVar60._8_4_;
    auVar235._12_4_ = fVar221 * auVar60._12_4_;
    auVar47 = vmaxps_avx(auVar47,auVar52);
    auVar186._0_4_ = auVar40._0_4_ + auVar47._0_4_;
    auVar186._4_4_ = auVar40._4_4_ + auVar47._4_4_;
    auVar186._8_4_ = auVar40._8_4_ + auVar47._8_4_;
    auVar186._12_4_ = auVar40._12_4_ + auVar47._12_4_;
    auVar197._8_8_ = 0x3f800000;
    auVar197._0_8_ = 0x3f800000;
    auVar47 = vsubps_avx(auVar197,auVar186);
    auVar52 = vsubps_avx512vl(auVar197,auVar58);
    auVar247._0_4_ = fVar222 * auVar47._0_4_;
    auVar247._4_4_ = fVar223 * auVar47._4_4_;
    auVar247._8_4_ = fVar224 * auVar47._8_4_;
    auVar247._12_4_ = fVar178 * auVar47._12_4_;
    auVar241._0_4_ = fVar222 * auVar52._0_4_;
    auVar241._4_4_ = fVar223 * auVar52._4_4_;
    auVar241._8_4_ = fVar224 * auVar52._8_4_;
    auVar241._12_4_ = fVar178 * auVar52._12_4_;
    auVar187._0_4_ = fVar225 * auVar47._0_4_;
    auVar187._4_4_ = fVar209 * auVar47._4_4_;
    auVar187._8_4_ = fVar220 * auVar47._8_4_;
    auVar187._12_4_ = fVar221 * auVar47._12_4_;
    auVar198._0_4_ = fVar225 * auVar52._0_4_;
    auVar198._4_4_ = fVar209 * auVar52._4_4_;
    auVar198._8_4_ = fVar220 * auVar52._8_4_;
    auVar198._12_4_ = fVar221 * auVar52._12_4_;
    auVar47 = vminps_avx(auVar247,auVar241);
    auVar52 = vminps_avx512vl(auVar187,auVar198);
    auVar58 = vminps_avx512vl(auVar47,auVar52);
    auVar47 = vmaxps_avx(auVar241,auVar247);
    auVar52 = vmaxps_avx(auVar198,auVar187);
    auVar52 = vmaxps_avx(auVar52,auVar47);
    auVar59 = vminps_avx512vl(auVar257,auVar61);
    auVar47 = vminps_avx(auVar216,auVar235);
    auVar47 = vminps_avx(auVar59,auVar47);
    auVar47 = vhaddps_avx(auVar58,auVar47);
    auVar59 = vmaxps_avx512vl(auVar61,auVar257);
    auVar58 = vmaxps_avx(auVar235,auVar216);
    auVar58 = vmaxps_avx(auVar58,auVar59);
    auVar52 = vhaddps_avx(auVar52,auVar58);
    auVar47 = vshufps_avx(auVar47,auVar47,0xe8);
    auVar52 = vshufps_avx(auVar52,auVar52,0xe8);
    auVar188._0_4_ = auVar47._0_4_ + auVar39._0_4_;
    auVar188._4_4_ = auVar47._4_4_ + auVar39._4_4_;
    auVar188._8_4_ = auVar47._8_4_ + auVar39._8_4_;
    auVar188._12_4_ = auVar47._12_4_ + auVar39._12_4_;
    auVar199._0_4_ = auVar52._0_4_ + auVar39._0_4_;
    auVar199._4_4_ = auVar52._4_4_ + auVar39._4_4_;
    auVar199._8_4_ = auVar52._8_4_ + auVar39._8_4_;
    auVar199._12_4_ = auVar52._12_4_ + auVar39._12_4_;
    auVar47 = vmaxps_avx(auVar55,auVar188);
    auVar52 = vminps_avx(auVar199,auVar64);
    uVar1 = vcmpps_avx512vl(auVar52,auVar47,1);
  } while ((uVar1 & 3) != 0);
  uVar1 = vcmpps_avx512vl(auVar199,auVar64,1);
  uVar18 = vcmpps_avx512vl(auVar53,auVar188,1);
  if (((ushort)uVar18 & (ushort)uVar1 & 1) == 0) {
    bVar24 = 0;
  }
  else {
    auVar47 = vmovshdup_avx(auVar188);
    bVar24 = auVar42._0_4_ < auVar47._0_4_ & (byte)(uVar1 >> 1) & 0x7f;
  }
  if (((3 < (uint)uVar26 || uVar5 != 0 && !bVar36) | bVar24) != 1) goto LAB_01935ba8;
  lVar29 = 0xc9;
  do {
    lVar29 = lVar29 + -1;
    if (lVar29 == 0) goto LAB_01934d13;
    auVar53 = vsubss_avx512f(auVar41,auVar39);
    fVar220 = auVar53._0_4_;
    fVar225 = fVar220 * fVar220 * fVar220;
    auVar53 = vmulss_avx512f(auVar39,ZEXT416(0x40400000));
    fVar209 = auVar53._0_4_ * fVar220 * fVar220;
    fVar221 = auVar39._0_4_;
    auVar53 = vmulss_avx512f(ZEXT416((uint)(fVar221 * fVar221)),ZEXT416(0x40400000));
    fVar220 = fVar220 * auVar53._0_4_;
    auVar136._4_4_ = fVar225;
    auVar136._0_4_ = fVar225;
    auVar136._8_4_ = fVar225;
    auVar136._12_4_ = fVar225;
    auVar130._4_4_ = fVar209;
    auVar130._0_4_ = fVar209;
    auVar130._8_4_ = fVar209;
    auVar130._12_4_ = fVar209;
    auVar103._4_4_ = fVar220;
    auVar103._0_4_ = fVar220;
    auVar103._8_4_ = fVar220;
    auVar103._12_4_ = fVar220;
    fVar221 = fVar221 * fVar221 * fVar221;
    auVar168._0_4_ = (float)local_2a0._0_4_ * fVar221;
    auVar168._4_4_ = (float)local_2a0._4_4_ * fVar221;
    auVar168._8_4_ = fStack_298 * fVar221;
    auVar168._12_4_ = fStack_294 * fVar221;
    auVar53 = vfmadd231ps_fma(auVar168,auVar63,auVar103);
    auVar53 = vfmadd231ps_fma(auVar53,auVar54,auVar130);
    auVar53 = vfmadd231ps_fma(auVar53,auVar62,auVar136);
    auVar104._8_8_ = auVar53._0_8_;
    auVar104._0_8_ = auVar53._0_8_;
    auVar53 = vshufpd_avx(auVar53,auVar53,3);
    auVar47 = vshufps_avx(auVar39,auVar39,0x55);
    auVar53 = vsubps_avx(auVar53,auVar104);
    auVar47 = vfmadd213ps_fma(auVar53,auVar47,auVar104);
    fVar225 = auVar47._0_4_;
    auVar53 = vshufps_avx(auVar47,auVar47,0x55);
    auVar105._0_4_ = auVar46._0_4_ * fVar225 + auVar65._0_4_ * auVar53._0_4_;
    auVar105._4_4_ = auVar46._4_4_ * fVar225 + auVar65._4_4_ * auVar53._4_4_;
    auVar105._8_4_ = auVar46._8_4_ * fVar225 + auVar65._8_4_ * auVar53._8_4_;
    auVar105._12_4_ = auVar46._12_4_ * fVar225 + auVar65._12_4_ * auVar53._12_4_;
    auVar39 = vsubps_avx(auVar39,auVar105);
    auVar53 = vandps_avx512vl(auVar47,auVar264._0_16_);
    auVar47 = vprolq_avx512vl(auVar53,0x20);
    auVar53 = vmaxss_avx(auVar47,auVar53);
    bVar36 = (float)local_2b0._0_4_ < auVar53._0_4_;
  } while ((float)local_2b0._0_4_ <= auVar53._0_4_);
  auVar53 = vucomiss_avx512f(auVar43);
  if (bVar36) goto LAB_01934d13;
  auVar46 = vucomiss_avx512f(auVar53);
  auVar265 = ZEXT1664(auVar46);
  if (bVar36) goto LAB_01934d13;
  vmovshdup_avx(auVar53);
  auVar46 = vucomiss_avx512f(auVar43);
  if (bVar36) goto LAB_01934d13;
  auVar47 = vucomiss_avx512f(auVar46);
  auVar265 = ZEXT1664(auVar47);
  if (bVar36) goto LAB_01934d13;
  auVar52 = vinsertps_avx(ZEXT416((uint)pre->ray_space[k].vx.field_0.m128[2]),
                          ZEXT416((uint)pre->ray_space[k].vy.field_0.m128[2]),0x1c);
  auVar39 = vinsertps_avx(auVar52,ZEXT416((uint)pre->ray_space[k].vz.field_0.m128[2]),0x28);
  auVar52 = vdpps_avx(auVar39,local_2c0,0x7f);
  auVar55 = vdpps_avx(auVar39,local_2d0,0x7f);
  auVar58 = vdpps_avx(auVar39,local_2e0,0x7f);
  auVar59 = vdpps_avx(auVar39,local_2f0,0x7f);
  auVar60 = vdpps_avx(auVar39,local_300,0x7f);
  auVar61 = vdpps_avx(auVar39,local_310,0x7f);
  auVar38 = vdpps_avx(auVar39,local_320,0x7f);
  auVar39 = vdpps_avx(auVar39,local_330,0x7f);
  auVar40 = vsubss_avx512f(auVar47,auVar46);
  fVar225 = auVar46._0_4_;
  auVar46 = vfmadd231ss_fma(ZEXT416((uint)(fVar225 * auVar60._0_4_)),auVar40,auVar52);
  auVar52 = vfmadd231ss_fma(ZEXT416((uint)(auVar61._0_4_ * fVar225)),auVar40,auVar55);
  auVar55 = vfmadd231ss_fma(ZEXT416((uint)(auVar38._0_4_ * fVar225)),auVar40,auVar58);
  auVar58 = vfmadd231ss_fma(ZEXT416((uint)(fVar225 * auVar39._0_4_)),auVar40,auVar59);
  auVar47 = vsubss_avx512f(auVar47,auVar53);
  auVar169._0_4_ = auVar47._0_4_;
  fVar225 = auVar169._0_4_ * auVar169._0_4_ * auVar169._0_4_;
  auVar47 = vmulss_avx512f(auVar53,ZEXT416(0x40400000));
  fVar209 = auVar47._0_4_ * auVar169._0_4_ * auVar169._0_4_;
  local_120 = auVar53._0_4_;
  auVar154._0_4_ = local_120 * local_120;
  auVar154._4_4_ = auVar53._4_4_ * auVar53._4_4_;
  auVar154._8_4_ = auVar53._8_4_ * auVar53._8_4_;
  auVar154._12_4_ = auVar53._12_4_ * auVar53._12_4_;
  auVar47 = vmulss_avx512f(auVar154,ZEXT416(0x40400000));
  fVar220 = auVar169._0_4_ * auVar47._0_4_;
  fVar222 = local_120 * auVar154._0_4_;
  auVar47 = vfmadd231ss_fma(ZEXT416((uint)(fVar222 * auVar58._0_4_)),ZEXT416((uint)fVar220),auVar55)
  ;
  auVar47 = vfmadd231ss_fma(auVar47,ZEXT416((uint)fVar209),auVar52);
  auVar46 = vfmadd231ss_fma(auVar47,ZEXT416((uint)fVar225),auVar46);
  fVar221 = auVar46._0_4_;
  if ((fVar221 < fVar142) || (fVar223 = *(float *)(ray + k * 4 + 0x100), fVar223 < fVar221))
  goto LAB_01934d13;
  auVar46 = vshufps_avx(auVar53,auVar53,0x55);
  auVar189._8_4_ = 0x3f800000;
  auVar189._0_8_ = 0x3f8000003f800000;
  auVar189._12_4_ = 0x3f800000;
  auVar47 = vsubps_avx(auVar189,auVar46);
  fVar224 = auVar46._0_4_;
  auVar200._0_4_ = fVar224 * (float)local_380._0_4_;
  fVar178 = auVar46._4_4_;
  auVar200._4_4_ = fVar178 * (float)local_380._4_4_;
  fVar179 = auVar46._8_4_;
  auVar200._8_4_ = fVar179 * fStack_378;
  fVar180 = auVar46._12_4_;
  auVar200._12_4_ = fVar180 * fStack_374;
  auVar204._0_4_ = fVar224 * (float)local_390._0_4_;
  auVar204._4_4_ = fVar178 * (float)local_390._4_4_;
  auVar204._8_4_ = fVar179 * fStack_388;
  auVar204._12_4_ = fVar180 * fStack_384;
  auVar217._0_4_ = fVar224 * (float)local_3a0._0_4_;
  auVar217._4_4_ = fVar178 * (float)local_3a0._4_4_;
  auVar217._8_4_ = fVar179 * fStack_398;
  auVar217._12_4_ = fVar180 * fStack_394;
  auVar175._0_4_ = fVar224 * (float)local_3b0._0_4_;
  auVar175._4_4_ = fVar178 * (float)local_3b0._4_4_;
  auVar175._8_4_ = fVar179 * fStack_3a8;
  auVar175._12_4_ = fVar180 * fStack_3a4;
  auVar46 = vfmadd231ps_fma(auVar200,auVar47,local_340);
  auVar52 = vfmadd231ps_fma(auVar204,auVar47,local_350);
  auVar55 = vfmadd231ps_fma(auVar217,auVar47,local_360);
  auVar58 = vfmadd231ps_fma(auVar175,auVar47,local_370);
  auVar46 = vsubps_avx(auVar52,auVar46);
  auVar47 = vsubps_avx(auVar55,auVar52);
  auVar52 = vsubps_avx(auVar58,auVar55);
  auVar218._0_4_ = local_120 * auVar47._0_4_;
  auVar218._4_4_ = local_120 * auVar47._4_4_;
  auVar218._8_4_ = local_120 * auVar47._8_4_;
  auVar218._12_4_ = local_120 * auVar47._12_4_;
  auVar169._4_4_ = auVar169._0_4_;
  auVar169._8_4_ = auVar169._0_4_;
  auVar169._12_4_ = auVar169._0_4_;
  auVar46 = vfmadd231ps_fma(auVar218,auVar169,auVar46);
  auVar176._0_4_ = local_120 * auVar52._0_4_;
  auVar176._4_4_ = local_120 * auVar52._4_4_;
  auVar176._8_4_ = local_120 * auVar52._8_4_;
  auVar176._12_4_ = local_120 * auVar52._12_4_;
  auVar47 = vfmadd231ps_fma(auVar176,auVar169,auVar47);
  auVar177._0_4_ = local_120 * auVar47._0_4_;
  auVar177._4_4_ = local_120 * auVar47._4_4_;
  auVar177._8_4_ = local_120 * auVar47._8_4_;
  auVar177._12_4_ = local_120 * auVar47._12_4_;
  auVar46 = vfmadd231ps_fma(auVar177,auVar169,auVar46);
  auVar45 = vmulps_avx512vl(auVar46,auVar45);
  pGVar6 = (context->scene->geometries).items[uVar4].ptr;
  if ((pGVar6->mask & *(uint *)(ray + k * 4 + 0x120)) != 0) {
    if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
       (bVar24 = 1, pGVar6->occlusionFilterN == (RTCFilterFunctionN)0x0)) goto LAB_01935ba0;
    auVar155._0_4_ = fVar222 * (float)local_400._0_4_;
    auVar155._4_4_ = fVar222 * (float)local_400._4_4_;
    auVar155._8_4_ = fVar222 * fStack_3f8;
    auVar155._12_4_ = fVar222 * fStack_3f4;
    auVar137._4_4_ = fVar220;
    auVar137._0_4_ = fVar220;
    auVar137._8_4_ = fVar220;
    auVar137._12_4_ = fVar220;
    auVar46 = vfmadd132ps_fma(auVar137,auVar155,local_3f0);
    auVar131._4_4_ = fVar209;
    auVar131._0_4_ = fVar209;
    auVar131._8_4_ = fVar209;
    auVar131._12_4_ = fVar209;
    auVar46 = vfmadd132ps_fma(auVar131,auVar46,local_3e0);
    auVar117._4_4_ = fVar225;
    auVar117._0_4_ = fVar225;
    auVar117._8_4_ = fVar225;
    auVar117._12_4_ = fVar225;
    auVar52 = vfmadd132ps_fma(auVar117,auVar46,local_3d0);
    auVar46 = vshufps_avx(auVar52,auVar52,0xc9);
    auVar47 = vshufps_avx(auVar45,auVar45,0xc9);
    auVar118._0_4_ = auVar52._0_4_ * auVar47._0_4_;
    auVar118._4_4_ = auVar52._4_4_ * auVar47._4_4_;
    auVar118._8_4_ = auVar52._8_4_ * auVar47._8_4_;
    auVar118._12_4_ = auVar52._12_4_ * auVar47._12_4_;
    auVar45 = vfmsub231ps_fma(auVar118,auVar45,auVar46);
    auVar139._8_4_ = 1;
    auVar139._0_8_ = 0x100000001;
    auVar139._12_4_ = 1;
    auVar139._16_4_ = 1;
    auVar139._20_4_ = 1;
    auVar139._24_4_ = 1;
    auVar139._28_4_ = 1;
    local_100 = vpermps_avx2(auVar139,ZEXT1632(auVar53));
    auVar67 = vpermps_avx2(auVar139,ZEXT1632(auVar45));
    auVar159._8_4_ = 2;
    auVar159._0_8_ = 0x200000002;
    auVar159._12_4_ = 2;
    auVar159._16_4_ = 2;
    auVar159._20_4_ = 2;
    auVar159._24_4_ = 2;
    auVar159._28_4_ = 2;
    local_160 = vpermps_avx2(auVar159,ZEXT1632(auVar45));
    local_140 = auVar45._0_4_;
    local_180[0] = (RTCHitN)auVar67[0];
    local_180[1] = (RTCHitN)auVar67[1];
    local_180[2] = (RTCHitN)auVar67[2];
    local_180[3] = (RTCHitN)auVar67[3];
    local_180[4] = (RTCHitN)auVar67[4];
    local_180[5] = (RTCHitN)auVar67[5];
    local_180[6] = (RTCHitN)auVar67[6];
    local_180[7] = (RTCHitN)auVar67[7];
    local_180[8] = (RTCHitN)auVar67[8];
    local_180[9] = (RTCHitN)auVar67[9];
    local_180[10] = (RTCHitN)auVar67[10];
    local_180[0xb] = (RTCHitN)auVar67[0xb];
    local_180[0xc] = (RTCHitN)auVar67[0xc];
    local_180[0xd] = (RTCHitN)auVar67[0xd];
    local_180[0xe] = (RTCHitN)auVar67[0xe];
    local_180[0xf] = (RTCHitN)auVar67[0xf];
    local_180[0x10] = (RTCHitN)auVar67[0x10];
    local_180[0x11] = (RTCHitN)auVar67[0x11];
    local_180[0x12] = (RTCHitN)auVar67[0x12];
    local_180[0x13] = (RTCHitN)auVar67[0x13];
    local_180[0x14] = (RTCHitN)auVar67[0x14];
    local_180[0x15] = (RTCHitN)auVar67[0x15];
    local_180[0x16] = (RTCHitN)auVar67[0x16];
    local_180[0x17] = (RTCHitN)auVar67[0x17];
    local_180[0x18] = (RTCHitN)auVar67[0x18];
    local_180[0x19] = (RTCHitN)auVar67[0x19];
    local_180[0x1a] = (RTCHitN)auVar67[0x1a];
    local_180[0x1b] = (RTCHitN)auVar67[0x1b];
    local_180[0x1c] = (RTCHitN)auVar67[0x1c];
    local_180[0x1d] = (RTCHitN)auVar67[0x1d];
    local_180[0x1e] = (RTCHitN)auVar67[0x1e];
    local_180[0x1f] = (RTCHitN)auVar67[0x1f];
    uStack_13c = local_140;
    uStack_138 = local_140;
    uStack_134 = local_140;
    uStack_130 = local_140;
    uStack_12c = local_140;
    uStack_128 = local_140;
    uStack_124 = local_140;
    fStack_11c = local_120;
    fStack_118 = local_120;
    fStack_114 = local_120;
    fStack_110 = local_120;
    fStack_10c = local_120;
    fStack_108 = local_120;
    fStack_104 = local_120;
    local_e0 = local_1c0._0_8_;
    uStack_d8 = local_1c0._8_8_;
    uStack_d0 = local_1c0._16_8_;
    uStack_c8 = local_1c0._24_8_;
    local_c0 = local_1e0;
    vpcmpeqd_avx2(local_1e0,local_1e0);
    uStack_9c = context->user->instID[0];
    local_a0 = uStack_9c;
    uStack_98 = uStack_9c;
    uStack_94 = uStack_9c;
    uStack_90 = uStack_9c;
    uStack_8c = uStack_9c;
    uStack_88 = uStack_9c;
    uStack_84 = uStack_9c;
    uStack_7c = context->user->instPrimID[0];
    local_80 = uStack_7c;
    uStack_78 = uStack_7c;
    uStack_74 = uStack_7c;
    uStack_70 = uStack_7c;
    uStack_6c = uStack_7c;
    uStack_68 = uStack_7c;
    uStack_64 = uStack_7c;
    *(float *)(ray + k * 4 + 0x100) = fVar221;
    local_420 = local_200;
    local_450.valid = (int *)local_420;
    local_450.geometryUserPtr = pGVar6->userPtr;
    local_450.context = context->user;
    local_450.ray = (RTCRayN *)ray;
    local_450.hit = local_180;
    local_450.N = 8;
    if (pGVar6->occlusionFilterN != (RTCFilterFunctionN)0x0) {
      (*pGVar6->occlusionFilterN)(&local_450);
      auVar262 = ZEXT3264(_DAT_01fb9fe0);
      auVar53 = vbroadcastss_avx512vl(ZEXT416(0x3e124925));
      auVar261 = ZEXT1664(auVar53);
      auVar67 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
      auVar260 = ZEXT3264(auVar67);
      auVar53 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
      auVar266 = ZEXT1664(auVar53);
      auVar265 = ZEXT464(0x3f800000);
      auVar53 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
      auVar263 = ZEXT1664(auVar53);
      auVar53 = vxorps_avx512vl(auVar43,auVar43);
      auVar259 = ZEXT1664(auVar53);
      auVar53 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
      auVar264 = ZEXT1664(auVar53);
    }
    auVar53 = auVar259._0_16_;
    if (local_420 != (undefined1  [32])0x0) {
      p_Var9 = context->args->filter;
      if ((p_Var9 != (RTCFilterFunctionN)0x0) &&
         (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
           RTC_RAY_QUERY_FLAG_INCOHERENT || (((pGVar6->field_8).field_0x2 & 0x40) != 0)))) {
        (*p_Var9)(&local_450);
        auVar262 = ZEXT3264(_DAT_01fb9fe0);
        auVar43 = vbroadcastss_avx512vl(ZEXT416(0x3e124925));
        auVar261 = ZEXT1664(auVar43);
        auVar67 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
        auVar260 = ZEXT3264(auVar67);
        auVar43 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
        auVar266 = ZEXT1664(auVar43);
        auVar265 = ZEXT464(0x3f800000);
        auVar43 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
        auVar263 = ZEXT1664(auVar43);
        auVar53 = vxorps_avx512vl(auVar53,auVar53);
        auVar259 = ZEXT1664(auVar53);
        auVar53 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
        auVar264 = ZEXT1664(auVar53);
      }
      uVar1 = vptestmd_avx512vl(local_420,local_420);
      auVar67 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
      bVar36 = (bool)((byte)uVar1 & 1);
      bVar37 = (bool)((byte)(uVar1 >> 1) & 1);
      bVar34 = (bool)((byte)(uVar1 >> 2) & 1);
      bVar35 = (bool)((byte)(uVar1 >> 3) & 1);
      bVar14 = (bool)((byte)(uVar1 >> 4) & 1);
      bVar15 = (bool)((byte)(uVar1 >> 5) & 1);
      bVar16 = (bool)((byte)(uVar1 >> 6) & 1);
      bVar17 = SUB81(uVar1 >> 7,0);
      *(uint *)(local_450.ray + 0x100) =
           (uint)bVar36 * auVar67._0_4_ | (uint)!bVar36 * *(int *)(local_450.ray + 0x100);
      *(uint *)(local_450.ray + 0x104) =
           (uint)bVar37 * auVar67._4_4_ | (uint)!bVar37 * *(int *)(local_450.ray + 0x104);
      *(uint *)(local_450.ray + 0x108) =
           (uint)bVar34 * auVar67._8_4_ | (uint)!bVar34 * *(int *)(local_450.ray + 0x108);
      *(uint *)(local_450.ray + 0x10c) =
           (uint)bVar35 * auVar67._12_4_ | (uint)!bVar35 * *(int *)(local_450.ray + 0x10c);
      *(uint *)(local_450.ray + 0x110) =
           (uint)bVar14 * auVar67._16_4_ | (uint)!bVar14 * *(int *)(local_450.ray + 0x110);
      *(uint *)(local_450.ray + 0x114) =
           (uint)bVar15 * auVar67._20_4_ | (uint)!bVar15 * *(int *)(local_450.ray + 0x114);
      *(uint *)(local_450.ray + 0x118) =
           (uint)bVar16 * auVar67._24_4_ | (uint)!bVar16 * *(int *)(local_450.ray + 0x118);
      *(uint *)(local_450.ray + 0x11c) =
           (uint)bVar17 * auVar67._28_4_ | (uint)!bVar17 * *(int *)(local_450.ray + 0x11c);
      bVar24 = 1;
      if (local_420 != (undefined1  [32])0x0) goto LAB_01935ba0;
    }
    *(float *)(ray + k * 4 + 0x100) = fVar223;
  }
  bVar24 = 0;
LAB_01935ba0:
  bVar33 = (bool)(bVar33 | bVar24);
  goto LAB_01934d13;
LAB_01935ba8:
  auVar39 = vinsertps_avx(auVar42,auVar57,0x10);
  goto LAB_019347b3;
}

Assistant:

static __forceinline bool occluded_hn(Precalculations& pre, RayK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(shadow.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          const Vec3fa ray_org(ray.org.x[k], ray.org.y[k], ray.org.z[k]);
          const TensorLinearCubicBezierSurface3fa curve = geom->getNormalOrientedHermiteCurve<typename Intersector::SourceCurve3ff, typename Intersector::SourceCurve3fa, TensorLinearCubicBezierSurface3fa>(context, ray_org, primID,ray.time()[k]);
          if (Intersector().intersect(pre,ray,k,context,geom,primID,curve,Epilog(ray,k,context,geomID,primID)))
            return true;

          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
        return false;
      }